

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar59;
  ulong uVar60;
  uint uVar61;
  byte bVar63;
  uint uVar64;
  long lVar65;
  long lVar66;
  bool bVar67;
  vint4 bi_2;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar115 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar116 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vint4 bi_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar170;
  float fVar171;
  float fVar186;
  float fVar188;
  vint4 bi;
  undefined1 auVar172 [16];
  float fVar190;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar187;
  float fVar189;
  float fVar191;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar192;
  undefined1 auVar185 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar215;
  float fVar218;
  vint4 ai_2;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar221;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar216;
  float fVar217;
  float fVar219;
  float fVar220;
  float fVar222;
  float fVar223;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar224;
  float fVar237;
  float fVar238;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar239;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar240;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar241;
  float fVar254;
  vint4 ai;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar255 [16];
  undefined1 auVar253 [64];
  vint4 ai_1;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  float fVar284;
  undefined1 auVar283 [64];
  float fVar285;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar289 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar302 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [64];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [64];
  float fVar323;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar324;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar322 [64];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar333;
  undefined1 auVar332 [64];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float fVar345;
  vfloat4 a0;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float fStack_4a0;
  int local_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 auStack_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  ulong local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 auStack_308 [16];
  ulong local_2f8;
  Primitive *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  uint auStack_2a8 [4];
  undefined8 local_298;
  undefined4 local_290;
  undefined8 local_28c;
  undefined4 local_284;
  undefined4 local_280;
  uint local_27c;
  uint local_278;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  float afStack_1b8 [8];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar62;
  undefined1 auVar252 [32];
  undefined1 auVar339 [32];
  
  PVar8 = prim[1];
  uVar60 = (ulong)(byte)PVar8;
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar300 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  lVar65 = uVar60 * 0x25;
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar274 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar255 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x11 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar319 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  fVar193 = *(float *)(prim + lVar65 + 0x12);
  auVar118 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar65 + 6));
  auVar225._0_4_ = fVar193 * auVar118._0_4_;
  auVar225._4_4_ = fVar193 * auVar118._4_4_;
  auVar225._8_4_ = fVar193 * auVar118._8_4_;
  auVar225._12_4_ = fVar193 * auVar118._12_4_;
  auVar329._0_4_ = fVar193 * (ray->dir).field_0.m128[0];
  auVar329._4_4_ = fVar193 * (ray->dir).field_0.m128[1];
  auVar329._8_4_ = fVar193 * (ray->dir).field_0.m128[2];
  auVar329._12_4_ = fVar193 * (ray->dir).field_0.m128[3];
  auVar118 = vcvtdq2ps_avx(auVar300);
  auVar152 = vcvtdq2ps_avx(auVar166);
  auVar119 = vcvtdq2ps_avx(auVar130);
  auVar255 = vcvtdq2ps_avx(auVar255);
  auVar300 = vshufps_avx(auVar329,auVar329,0x55);
  auVar166 = vshufps_avx(auVar329,auVar329,0xaa);
  fVar170 = auVar166._0_4_;
  fVar186 = auVar166._4_4_;
  fVar188 = auVar166._8_4_;
  fVar190 = auVar166._12_4_;
  fVar193 = auVar300._0_4_;
  fVar215 = auVar300._4_4_;
  fVar218 = auVar300._8_4_;
  fVar221 = auVar300._12_4_;
  auVar273 = vcvtdq2ps_avx(auVar87);
  auVar15 = vcvtdq2ps_avx(auVar274);
  auVar319 = vcvtdq2ps_avx(auVar319);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar87 = vshufps_avx(auVar329,auVar329,0);
  fVar224 = auVar87._0_4_;
  fVar237 = auVar87._4_4_;
  fVar238 = auVar87._8_4_;
  fVar239 = auVar87._12_4_;
  auVar330._0_4_ = auVar118._0_4_ * fVar193 + fVar170 * auVar152._0_4_ + auVar273._0_4_ * fVar224;
  auVar330._4_4_ = auVar118._4_4_ * fVar215 + fVar186 * auVar152._4_4_ + auVar273._4_4_ * fVar237;
  auVar330._8_4_ = auVar118._8_4_ * fVar218 + fVar188 * auVar152._8_4_ + auVar273._8_4_ * fVar238;
  auVar330._12_4_ =
       auVar118._12_4_ * fVar221 + fVar190 * auVar152._12_4_ + auVar273._12_4_ * fVar239;
  auVar340._0_4_ = fVar224 * auVar15._0_4_ + fVar170 * auVar255._0_4_ + fVar193 * auVar119._0_4_;
  auVar340._4_4_ = fVar237 * auVar15._4_4_ + fVar186 * auVar255._4_4_ + fVar215 * auVar119._4_4_;
  auVar340._8_4_ = fVar238 * auVar15._8_4_ + fVar188 * auVar255._8_4_ + fVar218 * auVar119._8_4_;
  auVar340._12_4_ = fVar239 * auVar15._12_4_ + fVar190 * auVar255._12_4_ + fVar221 * auVar119._12_4_
  ;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar141 = vpmovsxwd_avx(auVar87);
  auVar87 = vcvtdq2ps_avx(auVar70);
  auVar172._0_4_ = fVar170 * auVar69._0_4_ + fVar193 * auVar319._0_4_ + fVar224 * auVar87._0_4_;
  auVar172._4_4_ = fVar186 * auVar69._4_4_ + fVar215 * auVar319._4_4_ + fVar237 * auVar87._4_4_;
  auVar172._8_4_ = fVar188 * auVar69._8_4_ + fVar218 * auVar319._8_4_ + fVar238 * auVar87._8_4_;
  auVar172._12_4_ = fVar190 * auVar69._12_4_ + fVar221 * auVar319._12_4_ + fVar239 * auVar87._12_4_;
  auVar300 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar193 = auVar300._0_4_;
  fVar215 = auVar300._4_4_;
  fVar218 = auVar300._8_4_;
  fVar221 = auVar300._12_4_;
  auVar300 = vshufps_avx(auVar225,auVar225,0x55);
  fVar170 = auVar300._0_4_;
  fVar186 = auVar300._4_4_;
  fVar188 = auVar300._8_4_;
  fVar190 = auVar300._12_4_;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar70 = vpmovsxwd_avx(auVar300);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar173 = vpmovsxwd_avx(auVar166);
  auVar274._8_8_ = 0;
  auVar274._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar274 = vpmovsxwd_avx(auVar274);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar130 = vpmovsxwd_avx(auVar130);
  auVar300 = vshufps_avx(auVar225,auVar225,0);
  fVar224 = auVar300._0_4_;
  fVar237 = auVar300._4_4_;
  fVar238 = auVar300._8_4_;
  fVar239 = auVar300._12_4_;
  auVar334._0_4_ = fVar170 * auVar118._0_4_ + auVar152._0_4_ * fVar193 + auVar273._0_4_ * fVar224;
  auVar334._4_4_ = fVar186 * auVar118._4_4_ + auVar152._4_4_ * fVar215 + auVar273._4_4_ * fVar237;
  auVar334._8_4_ = fVar188 * auVar118._8_4_ + auVar152._8_4_ * fVar218 + auVar273._8_4_ * fVar238;
  auVar334._12_4_ =
       fVar190 * auVar118._12_4_ + auVar152._12_4_ * fVar221 + auVar273._12_4_ * fVar239;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar60 * 0x16 + 6);
  auVar118 = vpmovsxwd_avx(auVar118);
  auVar140._0_4_ = fVar224 * auVar15._0_4_ + auVar255._0_4_ * fVar193 + fVar170 * auVar119._0_4_;
  auVar140._4_4_ = fVar237 * auVar15._4_4_ + auVar255._4_4_ * fVar215 + fVar186 * auVar119._4_4_;
  auVar140._8_4_ = fVar238 * auVar15._8_4_ + auVar255._8_4_ * fVar218 + fVar188 * auVar119._8_4_;
  auVar140._12_4_ = fVar239 * auVar15._12_4_ + auVar255._12_4_ * fVar221 + fVar190 * auVar119._12_4_
  ;
  auVar68._0_4_ = fVar224 * auVar87._0_4_ + fVar170 * auVar319._0_4_ + auVar69._0_4_ * fVar193;
  auVar68._4_4_ = fVar237 * auVar87._4_4_ + fVar186 * auVar319._4_4_ + auVar69._4_4_ * fVar215;
  auVar68._8_4_ = fVar238 * auVar87._8_4_ + fVar188 * auVar319._8_4_ + auVar69._8_4_ * fVar218;
  auVar68._12_4_ = fVar239 * auVar87._12_4_ + fVar190 * auVar319._12_4_ + auVar69._12_4_ * fVar221;
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar87 = vandps_avx(auVar330,auVar242);
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  auVar87 = vcmpps_avx(auVar87,auVar196,1);
  auVar300 = vblendvps_avx(auVar330,auVar196,auVar87);
  auVar87 = vandps_avx(auVar340,auVar242);
  auVar87 = vcmpps_avx(auVar87,auVar196,1);
  auVar166 = vblendvps_avx(auVar340,auVar196,auVar87);
  auVar87 = vandps_avx(auVar172,auVar242);
  auVar87 = vcmpps_avx(auVar87,auVar196,1);
  auVar87 = vblendvps_avx(auVar172,auVar196,auVar87);
  auVar152 = vrcpps_avx(auVar300);
  fVar170 = auVar152._0_4_;
  auVar107._0_4_ = fVar170 * auVar300._0_4_;
  fVar186 = auVar152._4_4_;
  auVar107._4_4_ = fVar186 * auVar300._4_4_;
  fVar188 = auVar152._8_4_;
  auVar107._8_4_ = fVar188 * auVar300._8_4_;
  fVar190 = auVar152._12_4_;
  auVar107._12_4_ = fVar190 * auVar300._12_4_;
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = 0x3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar300 = vsubps_avx(auVar266,auVar107);
  fVar170 = fVar170 + fVar170 * auVar300._0_4_;
  fVar186 = fVar186 + fVar186 * auVar300._4_4_;
  fVar188 = fVar188 + fVar188 * auVar300._8_4_;
  fVar190 = fVar190 + fVar190 * auVar300._12_4_;
  auVar300 = vrcpps_avx(auVar166);
  fVar193 = auVar300._0_4_;
  auVar197._0_4_ = fVar193 * auVar166._0_4_;
  fVar215 = auVar300._4_4_;
  auVar197._4_4_ = fVar215 * auVar166._4_4_;
  fVar218 = auVar300._8_4_;
  auVar197._8_4_ = fVar218 * auVar166._8_4_;
  fVar221 = auVar300._12_4_;
  auVar197._12_4_ = fVar221 * auVar166._12_4_;
  auVar300 = vsubps_avx(auVar266,auVar197);
  fVar193 = fVar193 + fVar193 * auVar300._0_4_;
  fVar215 = fVar215 + fVar215 * auVar300._4_4_;
  fVar218 = fVar218 + fVar218 * auVar300._8_4_;
  fVar221 = fVar221 + fVar221 * auVar300._12_4_;
  auVar300 = vrcpps_avx(auVar87);
  fVar224 = auVar300._0_4_;
  auVar226._0_4_ = fVar224 * auVar87._0_4_;
  fVar237 = auVar300._4_4_;
  auVar226._4_4_ = fVar237 * auVar87._4_4_;
  fVar238 = auVar300._8_4_;
  auVar226._8_4_ = fVar238 * auVar87._8_4_;
  fVar239 = auVar300._12_4_;
  auVar226._12_4_ = fVar239 * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar266,auVar226);
  fVar224 = fVar224 + fVar224 * auVar87._0_4_;
  fVar237 = fVar237 + fVar237 * auVar87._4_4_;
  fVar238 = fVar238 + fVar238 * auVar87._8_4_;
  fVar239 = fVar239 + fVar239 * auVar87._12_4_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar60 * 0x14 + 6);
  auVar166 = vpmovsxwd_avx(auVar152);
  auVar152 = vpermilps_avx(ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                          *(float *)(prim + lVar65 + 0x16)) *
                                         *(float *)(prim + lVar65 + 0x1a))),0);
  auVar87 = vcvtdq2ps_avx(auVar141);
  auVar300 = vcvtdq2ps_avx(auVar70);
  auVar300 = vsubps_avx(auVar300,auVar87);
  fVar104 = auVar152._0_4_;
  fVar105 = auVar152._4_4_;
  fVar106 = auVar152._8_4_;
  fVar192 = auVar152._12_4_;
  auVar243._0_4_ = fVar104 * auVar300._0_4_ + auVar87._0_4_;
  auVar243._4_4_ = fVar105 * auVar300._4_4_ + auVar87._4_4_;
  auVar243._8_4_ = fVar106 * auVar300._8_4_ + auVar87._8_4_;
  auVar243._12_4_ = fVar192 * auVar300._12_4_ + auVar87._12_4_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar152 = vpmovsxwd_avx(auVar119);
  auVar87 = vcvtdq2ps_avx(auVar173);
  auVar300 = vcvtdq2ps_avx(auVar274);
  auVar300 = vsubps_avx(auVar300,auVar87);
  auVar256._0_4_ = fVar104 * auVar300._0_4_ + auVar87._0_4_;
  auVar256._4_4_ = fVar105 * auVar300._4_4_ + auVar87._4_4_;
  auVar256._8_4_ = fVar106 * auVar300._8_4_ + auVar87._8_4_;
  auVar256._12_4_ = fVar192 * auVar300._12_4_ + auVar87._12_4_;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar274 = vpmovsxwd_avx(auVar255);
  auVar87 = vcvtdq2ps_avx(auVar130);
  auVar300 = vcvtdq2ps_avx(auVar118);
  auVar300 = vsubps_avx(auVar300,auVar87);
  auVar267._0_4_ = fVar104 * auVar300._0_4_ + auVar87._0_4_;
  auVar267._4_4_ = fVar105 * auVar300._4_4_ + auVar87._4_4_;
  auVar267._8_4_ = fVar106 * auVar300._8_4_ + auVar87._8_4_;
  auVar267._12_4_ = fVar192 * auVar300._12_4_ + auVar87._12_4_;
  auVar87 = vcvtdq2ps_avx(auVar166);
  auVar300 = vcvtdq2ps_avx(auVar152);
  auVar300 = vsubps_avx(auVar300,auVar87);
  auVar286._0_4_ = fVar104 * auVar300._0_4_ + auVar87._0_4_;
  auVar286._4_4_ = fVar105 * auVar300._4_4_ + auVar87._4_4_;
  auVar286._8_4_ = fVar106 * auVar300._8_4_ + auVar87._8_4_;
  auVar286._12_4_ = fVar192 * auVar300._12_4_ + auVar87._12_4_;
  auVar87 = vcvtdq2ps_avx(auVar274);
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *(ulong *)(prim + uVar60 * 0x21 + 6);
  auVar300 = vpmovsxwd_avx(auVar273);
  auVar300 = vcvtdq2ps_avx(auVar300);
  auVar300 = vsubps_avx(auVar300,auVar87);
  auVar295._0_4_ = fVar104 * auVar300._0_4_ + auVar87._0_4_;
  auVar295._4_4_ = fVar105 * auVar300._4_4_ + auVar87._4_4_;
  auVar295._8_4_ = fVar106 * auVar300._8_4_ + auVar87._8_4_;
  auVar295._12_4_ = fVar192 * auVar300._12_4_ + auVar87._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar60 * 0x1f + 6);
  auVar87 = vpmovsxwd_avx(auVar15);
  auVar319._8_8_ = 0;
  auVar319._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar300 = vpmovsxwd_avx(auVar319);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar300 = vcvtdq2ps_avx(auVar300);
  auVar300 = vsubps_avx(auVar300,auVar87);
  auVar309._0_4_ = fVar104 * auVar300._0_4_ + auVar87._0_4_;
  auVar309._4_4_ = fVar105 * auVar300._4_4_ + auVar87._4_4_;
  auVar309._8_4_ = fVar106 * auVar300._8_4_ + auVar87._8_4_;
  auVar309._12_4_ = fVar192 * auVar300._12_4_ + auVar87._12_4_;
  auVar87 = vsubps_avx(auVar243,auVar334);
  auVar244._0_4_ = fVar170 * auVar87._0_4_;
  auVar244._4_4_ = fVar186 * auVar87._4_4_;
  auVar244._8_4_ = fVar188 * auVar87._8_4_;
  auVar244._12_4_ = fVar190 * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar256,auVar334);
  auVar173._0_4_ = fVar170 * auVar87._0_4_;
  auVar173._4_4_ = fVar186 * auVar87._4_4_;
  auVar173._8_4_ = fVar188 * auVar87._8_4_;
  auVar173._12_4_ = fVar190 * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar267,auVar140);
  auVar257._0_4_ = fVar193 * auVar87._0_4_;
  auVar257._4_4_ = fVar215 * auVar87._4_4_;
  auVar257._8_4_ = fVar218 * auVar87._8_4_;
  auVar257._12_4_ = fVar221 * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar286,auVar140);
  auVar141._0_4_ = fVar193 * auVar87._0_4_;
  auVar141._4_4_ = fVar215 * auVar87._4_4_;
  auVar141._8_4_ = fVar218 * auVar87._8_4_;
  auVar141._12_4_ = fVar221 * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar295,auVar68);
  auVar198._0_4_ = fVar224 * auVar87._0_4_;
  auVar198._4_4_ = fVar237 * auVar87._4_4_;
  auVar198._8_4_ = fVar238 * auVar87._8_4_;
  auVar198._12_4_ = fVar239 * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar309,auVar68);
  auVar69._0_4_ = fVar224 * auVar87._0_4_;
  auVar69._4_4_ = fVar237 * auVar87._4_4_;
  auVar69._8_4_ = fVar238 * auVar87._8_4_;
  auVar69._12_4_ = fVar239 * auVar87._12_4_;
  auVar87 = vpminsd_avx(auVar244,auVar173);
  auVar300 = vpminsd_avx(auVar257,auVar141);
  auVar87 = vmaxps_avx(auVar87,auVar300);
  auVar300 = vpminsd_avx(auVar198,auVar69);
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar287._4_4_ = uVar4;
  auVar287._0_4_ = uVar4;
  auVar287._8_4_ = uVar4;
  auVar287._12_4_ = uVar4;
  auVar300 = vmaxps_avx(auVar300,auVar287);
  auVar87 = vmaxps_avx(auVar87,auVar300);
  local_228._0_4_ = auVar87._0_4_ * 0.99999964;
  local_228._4_4_ = auVar87._4_4_ * 0.99999964;
  local_228._8_4_ = auVar87._8_4_ * 0.99999964;
  local_228._12_4_ = auVar87._12_4_ * 0.99999964;
  auVar87 = vpmaxsd_avx(auVar244,auVar173);
  auVar300 = vpmaxsd_avx(auVar257,auVar141);
  auVar87 = vminps_avx(auVar87,auVar300);
  auVar300 = vpmaxsd_avx(auVar198,auVar69);
  fVar193 = ray->tfar;
  auVar174._4_4_ = fVar193;
  auVar174._0_4_ = fVar193;
  auVar174._8_4_ = fVar193;
  auVar174._12_4_ = fVar193;
  auVar300 = vminps_avx(auVar300,auVar174);
  auVar87 = vminps_avx(auVar87,auVar300);
  auVar70._0_4_ = auVar87._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar87._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar87._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar87._12_4_ * 1.0000004;
  auVar87 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar300 = vpcmpgtd_avx(auVar87,_DAT_01f4ad30);
  auVar87 = vcmpps_avx(local_228,auVar70,2);
  auVar87 = vandps_avx(auVar87,auVar300);
  auVar135._16_16_ = mm_lookupmask_ps._240_16_;
  auVar135._0_16_ = mm_lookupmask_ps._240_16_;
  uVar64 = vmovmskps_avx(auVar87);
  local_198 = vblendps_avx(auVar135,ZEXT832(0) << 0x20,0x80);
  auVar53 = ZEXT412(0);
  local_2f0 = prim;
LAB_00945aee:
  auVar55._12_4_ = 0;
  auVar55._0_12_ = auVar53;
  if (uVar64 == 0) {
LAB_00947cb9:
    return uVar64 != 0;
  }
  lVar65 = 0;
  if (uVar64 != 0) {
    for (; (uVar64 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
    }
  }
  local_400 = (ulong)*(uint *)(local_2f0 + 2);
  local_2f8 = (ulong)*(uint *)(local_2f0 + lVar65 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_400].ptr;
  fVar193 = (pGVar9->time_range).lower;
  fVar193 = pGVar9->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar193) / ((pGVar9->time_range).upper - fVar193));
  auVar87 = vroundss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),9);
  auVar87 = vminss_avx(auVar87,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar87 = vmaxss_avx(auVar55 << 0x20,auVar87);
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_2f8 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar87._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar66);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar66);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar60);
  fVar224 = *pfVar3;
  fVar215 = pfVar3[1];
  fVar237 = pfVar3[2];
  fVar218 = pfVar3[3];
  lVar65 = uVar60 + 1;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar65);
  fVar238 = *pfVar3;
  fVar221 = pfVar3[1];
  fVar239 = pfVar3[2];
  fVar170 = pfVar3[3];
  lVar1 = uVar60 + 2;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar186 = *pfVar3;
  fVar188 = pfVar3[1];
  fVar190 = pfVar3[2];
  fVar104 = pfVar3[3];
  lVar2 = uVar60 + 3;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar105 = *pfVar3;
  fVar106 = pfVar3[1];
  fVar192 = pfVar3[2];
  fVar240 = pfVar3[3];
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar66);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar66);
  pfVar3 = (float *)(lVar12 + lVar13 * uVar60);
  fVar171 = *pfVar3;
  fVar187 = pfVar3[1];
  fVar189 = pfVar3[2];
  fVar191 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar65);
  fVar194 = *pfVar3;
  fVar216 = pfVar3[1];
  fVar219 = pfVar3[2];
  fVar222 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
  fVar323 = *pfVar3;
  fVar284 = pfVar3[1];
  fVar324 = pfVar3[2];
  fVar285 = pfVar3[3];
  fVar193 = fVar193 - auVar87._0_4_;
  pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
  fVar195 = *pfVar3;
  fVar217 = pfVar3[1];
  fVar220 = pfVar3[2];
  fVar223 = pfVar3[3];
  auVar71._0_4_ = fVar238 * 0.0 + fVar186 * 0.5 + fVar105 * 0.0;
  auVar71._4_4_ = fVar221 * 0.0 + fVar188 * 0.5 + fVar106 * 0.0;
  auVar71._8_4_ = fVar239 * 0.0 + fVar190 * 0.5 + fVar192 * 0.0;
  auVar71._12_4_ = fVar170 * 0.0 + fVar104 * 0.5 + fVar240 * 0.0;
  auVar142._0_4_ = fVar224 * 0.5;
  auVar142._4_4_ = fVar215 * 0.5;
  auVar142._8_4_ = fVar237 * 0.5;
  auVar142._12_4_ = fVar218 * 0.5;
  auVar119 = vsubps_avx(auVar71,auVar142);
  auVar72._0_4_ = fVar194 * 0.0 + fVar323 * 0.5 + fVar195 * 0.0;
  auVar72._4_4_ = fVar216 * 0.0 + fVar284 * 0.5 + fVar217 * 0.0;
  auVar72._8_4_ = fVar219 * 0.0 + fVar324 * 0.5 + fVar220 * 0.0;
  auVar72._12_4_ = fVar222 * 0.0 + fVar285 * 0.5 + fVar223 * 0.0;
  auVar335._0_4_ = fVar171 * 0.5;
  auVar335._4_4_ = fVar187 * 0.5;
  auVar335._8_4_ = fVar189 * 0.5;
  auVar335._12_4_ = fVar191 * 0.5;
  auVar274 = vsubps_avx(auVar72,auVar335);
  local_4b8._0_4_ = fVar224 * -0.0 + fVar186 * 0.0 + fVar105 * -0.0 + fVar238;
  local_4b8._4_4_ = fVar215 * -0.0 + fVar188 * 0.0 + fVar106 * -0.0 + fVar221;
  fStack_4b0 = fVar237 * -0.0 + fVar190 * 0.0 + fVar192 * -0.0 + fVar239;
  fStack_4ac = fVar218 * -0.0 + fVar104 * 0.0 + fVar240 * -0.0 + fVar170;
  local_4c8._0_4_ = fVar224 * -0.0 + fVar238 * 0.0 + fVar186 + fVar105 * -0.0;
  local_4c8._4_4_ = fVar215 * -0.0 + fVar221 * 0.0 + fVar188 + fVar106 * -0.0;
  fStack_4c0 = fVar237 * -0.0 + fVar239 * 0.0 + fVar190 + fVar192 * -0.0;
  fStack_4bc = fVar218 * -0.0 + fVar170 * 0.0 + fVar104 + fVar240 * -0.0;
  auVar268._0_4_ = fVar186 * 0.0 + fVar105 * 0.5;
  auVar268._4_4_ = fVar188 * 0.0 + fVar106 * 0.5;
  auVar268._8_4_ = fVar190 * 0.0 + fVar192 * 0.5;
  auVar268._12_4_ = fVar104 * 0.0 + fVar240 * 0.5;
  auVar199._0_4_ = fVar238 * 0.5;
  auVar199._4_4_ = fVar221 * 0.5;
  auVar199._8_4_ = fVar239 * 0.5;
  auVar199._12_4_ = fVar170 * 0.5;
  auVar87 = vsubps_avx(auVar268,auVar199);
  auVar341._0_4_ = fVar171 * -0.0 + fVar323 * 0.0 + fVar195 * -0.0 + fVar194;
  auVar341._4_4_ = fVar187 * -0.0 + fVar284 * 0.0 + fVar217 * -0.0 + fVar216;
  auVar341._8_4_ = fVar189 * -0.0 + fVar324 * 0.0 + fVar220 * -0.0 + fVar219;
  auVar341._12_4_ = fVar191 * -0.0 + fVar285 * 0.0 + fVar223 * -0.0 + fVar222;
  auVar288._0_4_ = fVar224 * 0.0 + auVar87._0_4_;
  auVar288._4_4_ = fVar215 * 0.0 + auVar87._4_4_;
  auVar288._8_4_ = fVar237 * 0.0 + auVar87._8_4_;
  auVar288._12_4_ = fVar218 * 0.0 + auVar87._12_4_;
  auVar175._0_4_ = fVar171 * -0.0 + fVar194 * 0.0 + fVar323 + fVar195 * -0.0;
  auVar175._4_4_ = fVar187 * -0.0 + fVar216 * 0.0 + fVar284 + fVar217 * -0.0;
  auVar175._8_4_ = fVar189 * -0.0 + fVar219 * 0.0 + fVar324 + fVar220 * -0.0;
  auVar175._12_4_ = fVar191 * -0.0 + fVar222 * 0.0 + fVar285 + fVar223 * -0.0;
  auVar200._0_4_ = fVar323 * 0.0 + fVar195 * 0.5;
  auVar200._4_4_ = fVar284 * 0.0 + fVar217 * 0.5;
  auVar200._8_4_ = fVar324 * 0.0 + fVar220 * 0.5;
  auVar200._12_4_ = fVar285 * 0.0 + fVar223 * 0.5;
  auVar258._0_4_ = fVar194 * 0.5;
  auVar258._4_4_ = fVar216 * 0.5;
  auVar258._8_4_ = fVar219 * 0.5;
  auVar258._12_4_ = fVar222 * 0.5;
  auVar87 = vsubps_avx(auVar200,auVar258);
  auVar201._0_4_ = fVar171 * 0.0 + auVar87._0_4_;
  auVar201._4_4_ = fVar187 * 0.0 + auVar87._4_4_;
  auVar201._8_4_ = fVar189 * 0.0 + auVar87._8_4_;
  auVar201._12_4_ = fVar191 * 0.0 + auVar87._12_4_;
  auVar87 = vshufps_avx(auVar119,auVar119,0xc9);
  auVar300 = vshufps_avx(auVar341,auVar341,0xc9);
  fVar241 = auVar119._0_4_;
  auVar227._0_4_ = fVar241 * auVar300._0_4_;
  fVar254 = auVar119._4_4_;
  auVar227._4_4_ = fVar254 * auVar300._4_4_;
  fVar325 = auVar119._8_4_;
  auVar227._8_4_ = fVar325 * auVar300._8_4_;
  fVar326 = auVar119._12_4_;
  auVar227._12_4_ = fVar326 * auVar300._12_4_;
  auVar269._0_4_ = auVar341._0_4_ * auVar87._0_4_;
  auVar269._4_4_ = auVar341._4_4_ * auVar87._4_4_;
  auVar269._8_4_ = auVar341._8_4_ * auVar87._8_4_;
  auVar269._12_4_ = auVar341._12_4_ * auVar87._12_4_;
  auVar300 = vsubps_avx(auVar269,auVar227);
  auVar166 = vshufps_avx(auVar300,auVar300,0xc9);
  auVar300 = vshufps_avx(auVar274,auVar274,0xc9);
  auVar270._0_4_ = auVar300._0_4_ * fVar241;
  auVar270._4_4_ = auVar300._4_4_ * fVar254;
  auVar270._8_4_ = auVar300._8_4_ * fVar325;
  auVar270._12_4_ = auVar300._12_4_ * fVar326;
  auVar73._0_4_ = auVar87._0_4_ * auVar274._0_4_;
  auVar73._4_4_ = auVar87._4_4_ * auVar274._4_4_;
  auVar73._8_4_ = auVar87._8_4_ * auVar274._8_4_;
  auVar73._12_4_ = auVar87._12_4_ * auVar274._12_4_;
  auVar87 = vsubps_avx(auVar73,auVar270);
  auVar274 = vshufps_avx(auVar87,auVar87,0xc9);
  auVar87 = vshufps_avx(auVar288,auVar288,0xc9);
  auVar300 = vshufps_avx(auVar175,auVar175,0xc9);
  auVar271._0_4_ = auVar288._0_4_ * auVar300._0_4_;
  auVar271._4_4_ = auVar288._4_4_ * auVar300._4_4_;
  auVar271._8_4_ = auVar288._8_4_ * auVar300._8_4_;
  auVar271._12_4_ = auVar288._12_4_ * auVar300._12_4_;
  auVar176._0_4_ = auVar87._0_4_ * auVar175._0_4_;
  auVar176._4_4_ = auVar87._4_4_ * auVar175._4_4_;
  auVar176._8_4_ = auVar87._8_4_ * auVar175._8_4_;
  auVar176._12_4_ = auVar87._12_4_ * auVar175._12_4_;
  auVar300 = vsubps_avx(auVar176,auVar271);
  auVar130 = vshufps_avx(auVar300,auVar300,0xc9);
  auVar300 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar272._0_4_ = auVar288._0_4_ * auVar300._0_4_;
  auVar272._4_4_ = auVar288._4_4_ * auVar300._4_4_;
  auVar272._8_4_ = auVar288._8_4_ * auVar300._8_4_;
  auVar272._12_4_ = auVar288._12_4_ * auVar300._12_4_;
  auVar202._0_4_ = auVar87._0_4_ * auVar201._0_4_;
  auVar202._4_4_ = auVar87._4_4_ * auVar201._4_4_;
  auVar202._8_4_ = auVar87._8_4_ * auVar201._8_4_;
  auVar202._12_4_ = auVar87._12_4_ * auVar201._12_4_;
  auVar87 = vsubps_avx(auVar202,auVar272);
  auVar118 = vshufps_avx(auVar87,auVar87,0xc9);
  auVar87 = vdpps_avx(auVar166,auVar166,0x7f);
  fVar215 = auVar87._0_4_;
  auVar273 = ZEXT416((uint)fVar215);
  auVar300 = vrsqrtss_avx(auVar273,auVar273);
  fVar224 = auVar300._0_4_;
  auVar300 = vdpps_avx(auVar166,auVar274,0x7f);
  auVar152 = ZEXT416((uint)(fVar224 * 1.5 - fVar215 * 0.5 * fVar224 * fVar224 * fVar224));
  auVar152 = vshufps_avx(auVar152,auVar152,0);
  fVar194 = auVar152._0_4_ * auVar166._0_4_;
  fVar216 = auVar152._4_4_ * auVar166._4_4_;
  fVar219 = auVar152._8_4_ * auVar166._8_4_;
  fVar222 = auVar152._12_4_ * auVar166._12_4_;
  auVar87 = vshufps_avx(auVar87,auVar87,0);
  auVar74._0_4_ = auVar87._0_4_ * auVar274._0_4_;
  auVar74._4_4_ = auVar87._4_4_ * auVar274._4_4_;
  auVar74._8_4_ = auVar87._8_4_ * auVar274._8_4_;
  auVar74._12_4_ = auVar87._12_4_ * auVar274._12_4_;
  auVar87 = vshufps_avx(auVar300,auVar300,0);
  auVar228._0_4_ = auVar87._0_4_ * auVar166._0_4_;
  auVar228._4_4_ = auVar87._4_4_ * auVar166._4_4_;
  auVar228._8_4_ = auVar87._8_4_ * auVar166._8_4_;
  auVar228._12_4_ = auVar87._12_4_ * auVar166._12_4_;
  auVar255 = vsubps_avx(auVar74,auVar228);
  auVar87 = vrcpss_avx(auVar273,auVar273);
  auVar87 = ZEXT416((uint)(auVar87._0_4_ * (2.0 - fVar215 * auVar87._0_4_)));
  auVar166 = vshufps_avx(auVar87,auVar87,0);
  auVar87 = vdpps_avx(auVar130,auVar130,0x7f);
  fVar323 = auVar87._0_4_;
  auVar274 = ZEXT416((uint)fVar323);
  auVar300 = vrsqrtss_avx(auVar274,auVar274);
  fVar171 = auVar300._0_4_;
  auVar300 = vdpps_avx(auVar130,auVar118,0x7f);
  auVar87 = vshufps_avx(auVar87,auVar87,0);
  auVar342._0_4_ = auVar118._0_4_ * auVar87._0_4_;
  auVar342._4_4_ = auVar118._4_4_ * auVar87._4_4_;
  auVar342._8_4_ = auVar118._8_4_ * auVar87._8_4_;
  auVar342._12_4_ = auVar118._12_4_ * auVar87._12_4_;
  lVar12 = *(long *)(_Var10 + 0x38 + lVar66);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar66);
  pfVar3 = (float *)(lVar12 + lVar13 * uVar60);
  fVar224 = *pfVar3;
  fVar215 = pfVar3[1];
  fVar237 = pfVar3[2];
  fVar218 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar65);
  fVar238 = *pfVar3;
  fVar221 = pfVar3[1];
  fVar239 = pfVar3[2];
  fVar170 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
  fVar186 = *pfVar3;
  fVar188 = pfVar3[1];
  fVar190 = pfVar3[2];
  fVar104 = pfVar3[3];
  auVar87 = vshufps_avx(auVar300,auVar300,0);
  auVar75._0_4_ = auVar87._0_4_ * auVar130._0_4_;
  auVar75._4_4_ = auVar87._4_4_ * auVar130._4_4_;
  auVar75._8_4_ = auVar87._8_4_ * auVar130._8_4_;
  auVar75._12_4_ = auVar87._12_4_ * auVar130._12_4_;
  auVar118 = vsubps_avx(auVar342,auVar75);
  pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
  fVar105 = *pfVar3;
  fVar106 = pfVar3[1];
  fVar192 = pfVar3[2];
  fVar240 = pfVar3[3];
  lVar12 = *(long *)(lVar11 + 0x38 + lVar66);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar66);
  auVar87 = ZEXT416((uint)(fVar171 * 1.5 - fVar323 * 0.5 * fVar171 * fVar171 * fVar171));
  auVar300 = vshufps_avx(auVar87,auVar87,0);
  fVar171 = auVar300._0_4_ * auVar130._0_4_;
  fVar187 = auVar300._4_4_ * auVar130._4_4_;
  fVar189 = auVar300._8_4_ * auVar130._8_4_;
  fVar191 = auVar300._12_4_ * auVar130._12_4_;
  auVar87 = vrcpss_avx(auVar274,auVar274);
  auVar87 = ZEXT416((uint)(auVar87._0_4_ * (2.0 - auVar87._0_4_ * fVar323)));
  auVar87 = vshufps_avx(auVar87,auVar87,0);
  auVar274 = vshufps_avx(_local_4b8,_local_4b8,0xff);
  auVar316._0_4_ = auVar274._0_4_ * fVar194;
  auVar316._4_4_ = auVar274._4_4_ * fVar216;
  auVar316._8_4_ = auVar274._8_4_ * fVar219;
  auVar316._12_4_ = auVar274._12_4_ * fVar222;
  auVar130 = vshufps_avx(auVar119,auVar119,0xff);
  auVar273 = vsubps_avx(_local_4b8,auVar316);
  auVar259._0_4_ =
       auVar130._0_4_ * fVar194 + auVar274._0_4_ * auVar152._0_4_ * auVar255._0_4_ * auVar166._0_4_;
  auVar259._4_4_ =
       auVar130._4_4_ * fVar216 + auVar274._4_4_ * auVar152._4_4_ * auVar255._4_4_ * auVar166._4_4_;
  auVar259._8_4_ =
       auVar130._8_4_ * fVar219 + auVar274._8_4_ * auVar152._8_4_ * auVar255._8_4_ * auVar166._8_4_;
  auVar259._12_4_ =
       auVar130._12_4_ * fVar222 +
       auVar274._12_4_ * auVar152._12_4_ * auVar255._12_4_ * auVar166._12_4_;
  auVar255 = vsubps_avx(auVar119,auVar259);
  local_4b8._0_4_ = auVar316._0_4_ + (float)local_4b8._0_4_;
  local_4b8._4_4_ = auVar316._4_4_ + (float)local_4b8._4_4_;
  fStack_4b0 = auVar316._8_4_ + fStack_4b0;
  fStack_4ac = auVar316._12_4_ + fStack_4ac;
  auVar166 = vshufps_avx(_local_4c8,_local_4c8,0xff);
  auVar143._0_4_ = auVar166._0_4_ * fVar171;
  auVar143._4_4_ = auVar166._4_4_ * fVar187;
  auVar143._8_4_ = auVar166._8_4_ * fVar189;
  auVar143._12_4_ = auVar166._12_4_ * fVar191;
  auVar274 = vshufps_avx(auVar288,auVar288,0xff);
  auVar15 = vsubps_avx(_local_4c8,auVar143);
  auVar76._0_4_ =
       auVar274._0_4_ * fVar171 + auVar166._0_4_ * auVar300._0_4_ * auVar118._0_4_ * auVar87._0_4_;
  auVar76._4_4_ =
       auVar274._4_4_ * fVar187 + auVar166._4_4_ * auVar300._4_4_ * auVar118._4_4_ * auVar87._4_4_;
  auVar76._8_4_ =
       auVar274._8_4_ * fVar189 + auVar166._8_4_ * auVar300._8_4_ * auVar118._8_4_ * auVar87._8_4_;
  auVar76._12_4_ =
       auVar274._12_4_ * fVar191 +
       auVar166._12_4_ * auVar300._12_4_ * auVar118._12_4_ * auVar87._12_4_;
  auVar319 = vsubps_avx(auVar288,auVar76);
  local_4c8._0_4_ = (float)local_4c8._0_4_ + auVar143._0_4_;
  local_4c8._4_4_ = (float)local_4c8._4_4_ + auVar143._4_4_;
  fStack_4c0 = fStack_4c0 + auVar143._8_4_;
  fStack_4bc = fStack_4bc + auVar143._12_4_;
  auVar77._0_4_ = fVar238 * 0.0 + fVar186 * 0.5 + fVar105 * 0.0;
  auVar77._4_4_ = fVar221 * 0.0 + fVar188 * 0.5 + fVar106 * 0.0;
  auVar77._8_4_ = fVar239 * 0.0 + fVar190 * 0.5 + fVar192 * 0.0;
  auVar77._12_4_ = fVar170 * 0.0 + fVar104 * 0.5 + fVar240 * 0.0;
  auVar108._0_4_ = fVar224 * 0.5;
  auVar108._4_4_ = fVar215 * 0.5;
  auVar108._8_4_ = fVar237 * 0.5;
  auVar108._12_4_ = fVar218 * 0.5;
  auVar69 = vsubps_avx(auVar77,auVar108);
  pfVar3 = (float *)(lVar12 + lVar1 * lVar11);
  fVar171 = *pfVar3;
  fVar187 = pfVar3[1];
  fVar189 = pfVar3[2];
  fVar191 = pfVar3[3];
  auVar87 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  fVar195 = auVar87._0_4_;
  fVar217 = auVar87._4_4_;
  fVar220 = auVar87._8_4_;
  fVar223 = auVar87._12_4_;
  pfVar3 = (float *)(lVar12 + lVar65 * lVar11);
  fVar194 = *pfVar3;
  fVar216 = pfVar3[1];
  fVar219 = pfVar3[2];
  fVar222 = pfVar3[3];
  auVar245._0_4_ = fVar194 * 0.0 + fVar195 * 0.0 + fVar171 * 0.5;
  auVar245._4_4_ = fVar216 * 0.0 + fVar217 * 0.0 + fVar187 * 0.5;
  auVar245._8_4_ = fVar219 * 0.0 + fVar220 * 0.0 + fVar189 * 0.5;
  auVar245._12_4_ = fVar222 * 0.0 + fVar223 * 0.0 + fVar191 * 0.5;
  pfVar3 = (float *)(lVar12 + uVar60 * lVar11);
  fVar323 = *pfVar3;
  fVar284 = pfVar3[1];
  fVar324 = pfVar3[2];
  fVar285 = pfVar3[3];
  auVar275._0_4_ = fVar323 * 0.5;
  auVar275._4_4_ = fVar284 * 0.5;
  auVar275._8_4_ = fVar324 * 0.5;
  auVar275._12_4_ = fVar285 * 0.5;
  auVar300 = vsubps_avx(auVar245,auVar275);
  auVar276._0_4_ = fVar224 * -0.0 + fVar238 + fVar186 * 0.0 + fVar105 * -0.0;
  auVar276._4_4_ = fVar215 * -0.0 + fVar221 + fVar188 * 0.0 + fVar106 * -0.0;
  auVar276._8_4_ = fVar237 * -0.0 + fVar239 + fVar190 * 0.0 + fVar192 * -0.0;
  auVar276._12_4_ = fVar218 * -0.0 + fVar170 + fVar104 * 0.0 + fVar240 * -0.0;
  local_4d8._0_4_ = fVar224 * -0.0 + fVar238 * 0.0 + fVar186 + fVar105 * -0.0;
  local_4d8._4_4_ = fVar215 * -0.0 + fVar221 * 0.0 + fVar188 + fVar106 * -0.0;
  fStack_4d0 = fVar237 * -0.0 + fVar239 * 0.0 + fVar190 + fVar192 * -0.0;
  fStack_4cc = fVar218 * -0.0 + fVar170 * 0.0 + fVar104 + fVar240 * -0.0;
  auVar296._0_4_ = fVar186 * 0.0 + fVar105 * 0.5;
  auVar296._4_4_ = fVar188 * 0.0 + fVar106 * 0.5;
  auVar296._8_4_ = fVar190 * 0.0 + fVar192 * 0.5;
  auVar296._12_4_ = fVar104 * 0.0 + fVar240 * 0.5;
  auVar317._0_4_ = fVar238 * 0.5;
  auVar317._4_4_ = fVar221 * 0.5;
  auVar317._8_4_ = fVar239 * 0.5;
  auVar317._12_4_ = fVar170 * 0.5;
  auVar87 = vsubps_avx(auVar296,auVar317);
  auVar310._0_4_ = fVar224 * 0.0 + auVar87._0_4_;
  auVar310._4_4_ = fVar215 * 0.0 + auVar87._4_4_;
  auVar310._8_4_ = fVar237 * 0.0 + auVar87._8_4_;
  auVar310._12_4_ = fVar218 * 0.0 + auVar87._12_4_;
  auVar297._0_4_ = fVar323 * -0.0 + fVar194 + fVar195 * -0.0 + fVar171 * 0.0;
  auVar297._4_4_ = fVar284 * -0.0 + fVar216 + fVar217 * -0.0 + fVar187 * 0.0;
  auVar297._8_4_ = fVar324 * -0.0 + fVar219 + fVar220 * -0.0 + fVar189 * 0.0;
  auVar297._12_4_ = fVar285 * -0.0 + fVar222 + fVar223 * -0.0 + fVar191 * 0.0;
  auVar109._0_4_ = fVar323 * -0.0 + fVar195 * -0.0 + fVar171 + fVar194 * 0.0;
  auVar109._4_4_ = fVar284 * -0.0 + fVar217 * -0.0 + fVar187 + fVar216 * 0.0;
  auVar109._8_4_ = fVar324 * -0.0 + fVar220 * -0.0 + fVar189 + fVar219 * 0.0;
  auVar109._12_4_ = fVar285 * -0.0 + fVar223 * -0.0 + fVar191 + fVar222 * 0.0;
  auVar144._0_4_ = fVar171 * 0.0 + fVar195 * 0.5;
  auVar144._4_4_ = fVar187 * 0.0 + fVar217 * 0.5;
  auVar144._8_4_ = fVar189 * 0.0 + fVar220 * 0.5;
  auVar144._12_4_ = fVar191 * 0.0 + fVar223 * 0.5;
  auVar177._0_4_ = fVar194 * 0.5;
  auVar177._4_4_ = fVar216 * 0.5;
  auVar177._8_4_ = fVar219 * 0.5;
  auVar177._12_4_ = fVar222 * 0.5;
  auVar87 = vsubps_avx(auVar144,auVar177);
  auVar145._0_4_ = fVar323 * 0.0 + auVar87._0_4_;
  auVar145._4_4_ = fVar284 * 0.0 + auVar87._4_4_;
  auVar145._8_4_ = fVar324 * 0.0 + auVar87._8_4_;
  auVar145._12_4_ = fVar285 * 0.0 + auVar87._12_4_;
  auVar87 = vshufps_avx(auVar297,auVar297,0xc9);
  fVar186 = auVar69._0_4_;
  auVar78._0_4_ = fVar186 * auVar87._0_4_;
  fVar188 = auVar69._4_4_;
  auVar78._4_4_ = fVar188 * auVar87._4_4_;
  fVar190 = auVar69._8_4_;
  auVar78._8_4_ = fVar190 * auVar87._8_4_;
  fVar104 = auVar69._12_4_;
  auVar78._12_4_ = fVar104 * auVar87._12_4_;
  auVar87 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar298._0_4_ = auVar297._0_4_ * auVar87._0_4_;
  auVar298._4_4_ = auVar297._4_4_ * auVar87._4_4_;
  auVar298._8_4_ = auVar297._8_4_ * auVar87._8_4_;
  auVar298._12_4_ = auVar297._12_4_ * auVar87._12_4_;
  auVar166 = vsubps_avx(auVar298,auVar78);
  auVar79._0_4_ = auVar87._0_4_ * auVar300._0_4_;
  auVar79._4_4_ = auVar87._4_4_ * auVar300._4_4_;
  auVar79._8_4_ = auVar87._8_4_ * auVar300._8_4_;
  auVar79._12_4_ = auVar87._12_4_ * auVar300._12_4_;
  auVar87 = vshufps_avx(auVar300,auVar300,0xc9);
  auVar178._0_4_ = fVar186 * auVar87._0_4_;
  auVar178._4_4_ = fVar188 * auVar87._4_4_;
  auVar178._8_4_ = fVar190 * auVar87._8_4_;
  auVar178._12_4_ = fVar104 * auVar87._12_4_;
  auVar274 = vsubps_avx(auVar79,auVar178);
  auVar87 = vshufps_avx(auVar109,auVar109,0xc9);
  auVar80._0_4_ = auVar310._0_4_ * auVar87._0_4_;
  auVar80._4_4_ = auVar310._4_4_ * auVar87._4_4_;
  auVar80._8_4_ = auVar310._8_4_ * auVar87._8_4_;
  auVar80._12_4_ = auVar310._12_4_ * auVar87._12_4_;
  auVar87 = vshufps_avx(auVar310,auVar310,0xc9);
  auVar110._0_4_ = auVar87._0_4_ * auVar109._0_4_;
  auVar110._4_4_ = auVar87._4_4_ * auVar109._4_4_;
  auVar110._8_4_ = auVar87._8_4_ * auVar109._8_4_;
  auVar110._12_4_ = auVar87._12_4_ * auVar109._12_4_;
  auVar130 = vsubps_avx(auVar110,auVar80);
  auVar166 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar111._0_4_ = auVar87._0_4_ * auVar145._0_4_;
  auVar111._4_4_ = auVar87._4_4_ * auVar145._4_4_;
  auVar111._8_4_ = auVar87._8_4_ * auVar145._8_4_;
  auVar111._12_4_ = auVar87._12_4_ * auVar145._12_4_;
  auVar300 = vshufps_avx(auVar145,auVar145,0xc9);
  auVar87 = vdpps_avx(auVar166,auVar166,0x7f);
  auVar146._0_4_ = auVar310._0_4_ * auVar300._0_4_;
  auVar146._4_4_ = auVar310._4_4_ * auVar300._4_4_;
  auVar146._8_4_ = auVar310._8_4_ * auVar300._8_4_;
  auVar146._12_4_ = auVar310._12_4_ * auVar300._12_4_;
  auVar152 = vsubps_avx(auVar111,auVar146);
  auVar274 = vshufps_avx(auVar274,auVar274,0xc9);
  fVar215 = auVar87._0_4_;
  auVar118 = ZEXT416((uint)fVar215);
  auVar300 = vrsqrtss_avx(auVar118,auVar118);
  fVar224 = auVar300._0_4_;
  auVar300 = vdpps_avx(auVar166,auVar274,0x7f);
  auVar87 = vshufps_avx(auVar87,auVar87,0);
  auVar112._0_4_ = auVar87._0_4_ * auVar274._0_4_;
  auVar112._4_4_ = auVar87._4_4_ * auVar274._4_4_;
  auVar112._8_4_ = auVar87._8_4_ * auVar274._8_4_;
  auVar112._12_4_ = auVar87._12_4_ * auVar274._12_4_;
  auVar87 = vshufps_avx(auVar300,auVar300,0);
  auVar299._0_4_ = auVar87._0_4_ * auVar166._0_4_;
  auVar299._4_4_ = auVar87._4_4_ * auVar166._4_4_;
  auVar299._8_4_ = auVar87._8_4_ * auVar166._8_4_;
  auVar299._12_4_ = auVar87._12_4_ * auVar166._12_4_;
  auVar70 = vsubps_avx(auVar112,auVar299);
  auVar87 = vrcpss_avx(auVar118,auVar118);
  auVar87 = ZEXT416((uint)(auVar87._0_4_ * (2.0 - fVar215 * auVar87._0_4_)));
  auVar274 = vshufps_avx(auVar87,auVar87,0);
  auVar130 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar87 = ZEXT416((uint)(fVar224 * 1.5 - fVar215 * 0.5 * fVar224 * fVar224 * fVar224));
  auVar118 = vshufps_avx(auVar87,auVar87,0);
  auVar300 = vdpps_avx(auVar130,auVar130,0x7f);
  fVar224 = auVar166._0_4_ * auVar118._0_4_;
  fVar215 = auVar166._4_4_ * auVar118._4_4_;
  fVar237 = auVar166._8_4_ * auVar118._8_4_;
  fVar218 = auVar166._12_4_ * auVar118._12_4_;
  auVar152 = vshufps_avx(auVar152,auVar152,0xc9);
  auVar87 = vblendps_avx(auVar300,_DAT_01f45a50,0xe);
  auVar166 = vrsqrtss_avx(auVar87,auVar87);
  fVar238 = auVar166._0_4_;
  auVar166 = vdpps_avx(auVar130,auVar152,0x7f);
  auVar119 = vshufps_avx(auVar300,auVar300,0);
  auVar147._0_4_ = auVar119._0_4_ * auVar152._0_4_;
  auVar147._4_4_ = auVar119._4_4_ * auVar152._4_4_;
  auVar147._8_4_ = auVar119._8_4_ * auVar152._8_4_;
  auVar147._12_4_ = auVar119._12_4_ * auVar152._12_4_;
  auVar166 = vshufps_avx(auVar166,auVar166,0);
  auVar318._0_4_ = auVar166._0_4_ * auVar130._0_4_;
  auVar318._4_4_ = auVar166._4_4_ * auVar130._4_4_;
  auVar318._8_4_ = auVar166._8_4_ * auVar130._8_4_;
  auVar318._12_4_ = auVar166._12_4_ * auVar130._12_4_;
  auVar152 = vsubps_avx(auVar147,auVar318);
  auVar87 = vrcpss_avx(auVar87,auVar87);
  auVar87 = ZEXT416((uint)(auVar87._0_4_ * (2.0 - auVar300._0_4_ * auVar87._0_4_)));
  auVar87 = vshufps_avx(auVar87,auVar87,0);
  auVar300 = ZEXT416((uint)(fVar238 * 1.5 - auVar300._0_4_ * 0.5 * fVar238 * fVar238 * fVar238));
  auVar300 = vshufps_avx(auVar300,auVar300,0);
  fVar238 = auVar130._0_4_ * auVar300._0_4_;
  fVar221 = auVar130._4_4_ * auVar300._4_4_;
  fVar239 = auVar130._8_4_ * auVar300._8_4_;
  fVar170 = auVar130._12_4_ * auVar300._12_4_;
  auVar166 = vshufps_avx(auVar69,auVar69,0xff);
  auVar130 = vshufps_avx(auVar276,auVar276,0xff);
  auVar81._0_4_ = auVar130._0_4_ * fVar224;
  auVar81._4_4_ = auVar130._4_4_ * fVar215;
  auVar81._8_4_ = auVar130._8_4_ * fVar237;
  auVar81._12_4_ = auVar130._12_4_ * fVar218;
  auVar113._0_4_ =
       auVar166._0_4_ * fVar224 + auVar130._0_4_ * auVar118._0_4_ * auVar70._0_4_ * auVar274._0_4_;
  auVar113._4_4_ =
       auVar166._4_4_ * fVar215 + auVar130._4_4_ * auVar118._4_4_ * auVar70._4_4_ * auVar274._4_4_;
  auVar113._8_4_ =
       auVar166._8_4_ * fVar237 + auVar130._8_4_ * auVar118._8_4_ * auVar70._8_4_ * auVar274._8_4_;
  auVar113._12_4_ =
       auVar166._12_4_ * fVar218 +
       auVar130._12_4_ * auVar118._12_4_ * auVar70._12_4_ * auVar274._12_4_;
  auVar130 = vsubps_avx(auVar276,auVar81);
  auVar118 = vsubps_avx(auVar69,auVar113);
  auVar166 = vshufps_avx(auVar310,auVar310,0xff);
  auVar274 = vshufps_avx(_local_4d8,_local_4d8,0xff);
  auVar246._0_4_ = auVar274._0_4_ * fVar238;
  auVar246._4_4_ = auVar274._4_4_ * fVar221;
  auVar246._8_4_ = auVar274._8_4_ * fVar239;
  auVar246._12_4_ = auVar274._12_4_ * fVar170;
  auVar114._0_4_ =
       auVar166._0_4_ * fVar238 + auVar274._0_4_ * auVar300._0_4_ * auVar152._0_4_ * auVar87._0_4_;
  auVar114._4_4_ =
       auVar166._4_4_ * fVar221 + auVar274._4_4_ * auVar300._4_4_ * auVar152._4_4_ * auVar87._4_4_;
  auVar114._8_4_ =
       auVar166._8_4_ * fVar239 + auVar274._8_4_ * auVar300._8_4_ * auVar152._8_4_ * auVar87._8_4_;
  auVar114._12_4_ =
       auVar166._12_4_ * fVar170 +
       auVar274._12_4_ * auVar300._12_4_ * auVar152._12_4_ * auVar87._12_4_;
  auVar166 = vsubps_avx(_local_4d8,auVar246);
  local_4d8._0_4_ = (float)local_4d8._0_4_ + auVar246._0_4_;
  local_4d8._4_4_ = (float)local_4d8._4_4_ + auVar246._4_4_;
  fStack_4d0 = fStack_4d0 + auVar246._8_4_;
  fStack_4cc = fStack_4cc + auVar246._12_4_;
  auVar274 = vsubps_avx(auVar310,auVar114);
  local_3e8._0_4_ = auVar255._0_4_;
  local_3e8._4_4_ = auVar255._4_4_;
  fStack_3e0 = auVar255._8_4_;
  fStack_3dc = auVar255._12_4_;
  local_318._0_4_ = auVar273._0_4_;
  local_318._4_4_ = auVar273._4_4_;
  fStack_310 = auVar273._8_4_;
  fStack_30c = auVar273._12_4_;
  auVar87 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
  auVar300 = vshufps_avx(ZEXT416((uint)(1.0 - fVar193)),ZEXT416((uint)(1.0 - fVar193)),0);
  fVar218 = auVar87._0_4_;
  fVar238 = auVar87._4_4_;
  fVar221 = auVar87._8_4_;
  fVar239 = auVar87._12_4_;
  fVar193 = auVar300._0_4_;
  fVar224 = auVar300._4_4_;
  fVar215 = auVar300._8_4_;
  fVar237 = auVar300._12_4_;
  local_378._0_4_ = fVar193 * (float)local_318._0_4_ + fVar218 * auVar130._0_4_;
  local_378._4_4_ = fVar224 * (float)local_318._4_4_ + fVar238 * auVar130._4_4_;
  fStack_370 = fVar215 * fStack_310 + fVar221 * auVar130._8_4_;
  fStack_36c = fVar237 * fStack_30c + fVar239 * auVar130._12_4_;
  local_388._0_4_ =
       fVar193 * ((float)local_318._0_4_ + (float)local_3e8._0_4_ * 0.33333334) +
       fVar218 * (auVar130._0_4_ + auVar118._0_4_ * 0.33333334);
  local_388._4_4_ =
       fVar224 * ((float)local_318._4_4_ + (float)local_3e8._4_4_ * 0.33333334) +
       fVar238 * (auVar130._4_4_ + auVar118._4_4_ * 0.33333334);
  fStack_380 = fVar215 * (fStack_310 + fStack_3e0 * 0.33333334) +
               fVar221 * (auVar130._8_4_ + auVar118._8_4_ * 0.33333334);
  fStack_37c = fVar237 * (fStack_30c + fStack_3dc * 0.33333334) +
               fVar239 * (auVar130._12_4_ + auVar118._12_4_ * 0.33333334);
  local_468._0_4_ = auVar319._0_4_;
  local_468._4_4_ = auVar319._4_4_;
  fStack_460 = auVar319._8_4_;
  fStack_45c = auVar319._12_4_;
  auVar179._0_4_ = (float)local_468._0_4_ * 0.33333334;
  auVar179._4_4_ = (float)local_468._4_4_ * 0.33333334;
  auVar179._8_4_ = fStack_460 * 0.33333334;
  auVar179._12_4_ = fStack_45c * 0.33333334;
  auVar87 = vsubps_avx(auVar15,auVar179);
  auVar247._0_4_ = (auVar288._0_4_ + auVar76._0_4_) * 0.33333334;
  auVar247._4_4_ = (auVar288._4_4_ + auVar76._4_4_) * 0.33333334;
  auVar247._8_4_ = (auVar288._8_4_ + auVar76._8_4_) * 0.33333334;
  auVar247._12_4_ = (auVar288._12_4_ + auVar76._12_4_) * 0.33333334;
  auVar300 = vsubps_avx(_local_4c8,auVar247);
  auVar148._0_4_ = auVar274._0_4_ * 0.33333334;
  auVar148._4_4_ = auVar274._4_4_ * 0.33333334;
  auVar148._8_4_ = auVar274._8_4_ * 0.33333334;
  auVar148._12_4_ = auVar274._12_4_ * 0.33333334;
  auVar274 = vsubps_avx(auVar166,auVar148);
  auVar301._0_4_ = (auVar310._0_4_ + auVar114._0_4_) * 0.33333334;
  auVar301._4_4_ = (auVar310._4_4_ + auVar114._4_4_) * 0.33333334;
  auVar301._8_4_ = (auVar310._8_4_ + auVar114._8_4_) * 0.33333334;
  auVar301._12_4_ = (auVar310._12_4_ + auVar114._12_4_) * 0.33333334;
  auVar130 = vsubps_avx(_local_4d8,auVar301);
  local_398._0_4_ = fVar193 * auVar87._0_4_ + fVar218 * auVar274._0_4_;
  local_398._4_4_ = fVar224 * auVar87._4_4_ + fVar238 * auVar274._4_4_;
  fStack_390 = fVar215 * auVar87._8_4_ + fVar221 * auVar274._8_4_;
  fStack_38c = fVar237 * auVar87._12_4_ + fVar239 * auVar274._12_4_;
  local_3f8 = fVar218 * auVar166._0_4_ + fVar193 * auVar15._0_4_;
  fStack_3f4 = fVar238 * auVar166._4_4_ + fVar224 * auVar15._4_4_;
  fStack_3f0 = fVar221 * auVar166._8_4_ + fVar215 * auVar15._8_4_;
  fStack_3ec = fVar239 * auVar166._12_4_ + fVar237 * auVar15._12_4_;
  local_3a8._0_4_ = (float)local_4b8._0_4_ * fVar193 + fVar218 * (auVar276._0_4_ + auVar81._0_4_);
  local_3a8._4_4_ = (float)local_4b8._4_4_ * fVar224 + fVar238 * (auVar276._4_4_ + auVar81._4_4_);
  fStack_3a0 = fStack_4b0 * fVar215 + fVar221 * (auVar276._8_4_ + auVar81._8_4_);
  fStack_39c = fStack_4ac * fVar237 + fVar239 * (auVar276._12_4_ + auVar81._12_4_);
  local_3b8._0_4_ =
       fVar193 * ((float)local_4b8._0_4_ + (fVar241 + auVar259._0_4_) * 0.33333334) +
       fVar218 * (auVar276._0_4_ + auVar81._0_4_ + (fVar186 + auVar113._0_4_) * 0.33333334);
  local_3b8._4_4_ =
       fVar224 * ((float)local_4b8._4_4_ + (fVar254 + auVar259._4_4_) * 0.33333334) +
       fVar238 * (auVar276._4_4_ + auVar81._4_4_ + (fVar188 + auVar113._4_4_) * 0.33333334);
  fStack_3b0 = fVar215 * (fStack_4b0 + (fVar325 + auVar259._8_4_) * 0.33333334) +
               fVar221 * (auVar276._8_4_ + auVar81._8_4_ + (fVar190 + auVar113._8_4_) * 0.33333334);
  fStack_3ac = fVar237 * (fStack_4ac + (fVar326 + auVar259._12_4_) * 0.33333334) +
               fVar239 * (auVar276._12_4_ + auVar81._12_4_ +
                         (fVar104 + auVar113._12_4_) * 0.33333334);
  local_3c8._0_4_ = fVar193 * auVar300._0_4_ + fVar218 * auVar130._0_4_;
  local_3c8._4_4_ = fVar224 * auVar300._4_4_ + fVar238 * auVar130._4_4_;
  fStack_3c0 = fVar215 * auVar300._8_4_ + fVar221 * auVar130._8_4_;
  fStack_3bc = fVar237 * auVar300._12_4_ + fVar239 * auVar130._12_4_;
  local_2b8._0_4_ = (float)local_4c8._0_4_ * fVar193 + fVar218 * (float)local_4d8._0_4_;
  local_2b8._4_4_ = (float)local_4c8._4_4_ * fVar224 + fVar238 * (float)local_4d8._4_4_;
  fStack_2b0 = fStack_4c0 * fVar215 + fVar221 * fStack_4d0;
  fStack_2ac = fStack_4bc * fVar237 + fVar239 * fStack_4cc;
  aVar7 = (ray->org).field_0;
  auVar166 = vsubps_avx(_local_378,(undefined1  [16])aVar7);
  auVar300 = vmovsldup_avx(auVar166);
  auVar87 = vmovshdup_avx(auVar166);
  auVar166 = vshufps_avx(auVar166,auVar166,0xaa);
  fVar193 = (pre->ray_space).vx.field_0.m128[0];
  fVar224 = (pre->ray_space).vx.field_0.m128[1];
  fVar215 = (pre->ray_space).vx.field_0.m128[2];
  fVar237 = (pre->ray_space).vx.field_0.m128[3];
  fVar218 = (pre->ray_space).vy.field_0.m128[0];
  fVar238 = (pre->ray_space).vy.field_0.m128[1];
  fVar221 = (pre->ray_space).vy.field_0.m128[2];
  fVar239 = (pre->ray_space).vy.field_0.m128[3];
  fVar170 = (pre->ray_space).vz.field_0.m128[0];
  fVar186 = (pre->ray_space).vz.field_0.m128[1];
  fVar188 = (pre->ray_space).vz.field_0.m128[2];
  fVar190 = (pre->ray_space).vz.field_0.m128[3];
  local_4e8._4_4_ = fVar224 * auVar300._4_4_ + fVar238 * auVar87._4_4_ + fVar186 * auVar166._4_4_;
  local_4e8._0_4_ = fVar193 * auVar300._0_4_ + fVar218 * auVar87._0_4_ + fVar170 * auVar166._0_4_;
  fStack_4e0 = fVar215 * auVar300._8_4_ + fVar221 * auVar87._8_4_ + fVar188 * auVar166._8_4_;
  fStack_4dc = fVar237 * auVar300._12_4_ + fVar239 * auVar87._12_4_ + fVar190 * auVar166._12_4_;
  auVar166 = vsubps_avx(_local_388,(undefined1  [16])aVar7);
  auVar300 = vmovsldup_avx(auVar166);
  auVar87 = vmovshdup_avx(auVar166);
  auVar166 = vshufps_avx(auVar166,auVar166,0xaa);
  auVar115._0_8_ =
       CONCAT44(fVar224 * auVar300._4_4_ + fVar238 * auVar87._4_4_ + fVar186 * auVar166._4_4_,
                fVar193 * auVar300._0_4_ + fVar218 * auVar87._0_4_ + fVar170 * auVar166._0_4_);
  auVar115._8_4_ = fVar215 * auVar300._8_4_ + fVar221 * auVar87._8_4_ + fVar188 * auVar166._8_4_;
  auVar115._12_4_ = fVar237 * auVar300._12_4_ + fVar239 * auVar87._12_4_ + fVar190 * auVar166._12_4_
  ;
  auVar300 = vsubps_avx(_local_398,(undefined1  [16])aVar7);
  auVar166 = vshufps_avx(auVar300,auVar300,0xaa);
  auVar87 = vmovshdup_avx(auVar300);
  auVar300 = vmovsldup_avx(auVar300);
  auVar180._0_8_ =
       CONCAT44(fVar224 * auVar300._4_4_ + auVar87._4_4_ * fVar238 + fVar186 * auVar166._4_4_,
                fVar193 * auVar300._0_4_ + auVar87._0_4_ * fVar218 + fVar170 * auVar166._0_4_);
  auVar180._8_4_ = fVar215 * auVar300._8_4_ + auVar87._8_4_ * fVar221 + fVar188 * auVar166._8_4_;
  auVar180._12_4_ = fVar237 * auVar300._12_4_ + auVar87._12_4_ * fVar239 + fVar190 * auVar166._12_4_
  ;
  auVar56._4_4_ = fStack_3f4;
  auVar56._0_4_ = local_3f8;
  auVar56._8_4_ = fStack_3f0;
  auVar56._12_4_ = fStack_3ec;
  auVar300 = vsubps_avx(auVar56,(undefined1  [16])aVar7);
  auVar166 = vshufps_avx(auVar300,auVar300,0xaa);
  auVar87 = vmovshdup_avx(auVar300);
  auVar300 = vmovsldup_avx(auVar300);
  auVar260._0_8_ =
       CONCAT44(auVar87._4_4_ * fVar238 + auVar166._4_4_ * fVar186 + fVar224 * auVar300._4_4_,
                auVar87._0_4_ * fVar218 + auVar166._0_4_ * fVar170 + fVar193 * auVar300._0_4_);
  auVar260._8_4_ = auVar87._8_4_ * fVar221 + auVar166._8_4_ * fVar188 + fVar215 * auVar300._8_4_;
  auVar260._12_4_ = auVar87._12_4_ * fVar239 + auVar166._12_4_ * fVar190 + fVar237 * auVar300._12_4_
  ;
  auVar300 = vsubps_avx(_local_3a8,(undefined1  [16])aVar7);
  auVar166 = vshufps_avx(auVar300,auVar300,0xaa);
  auVar87 = vmovshdup_avx(auVar300);
  auVar300 = vmovsldup_avx(auVar300);
  auVar277._0_4_ = auVar300._0_4_ * fVar193 + auVar87._0_4_ * fVar218 + auVar166._0_4_ * fVar170;
  auVar277._4_4_ = auVar300._4_4_ * fVar224 + auVar87._4_4_ * fVar238 + auVar166._4_4_ * fVar186;
  auVar277._8_4_ = auVar300._8_4_ * fVar215 + auVar87._8_4_ * fVar221 + auVar166._8_4_ * fVar188;
  auVar277._12_4_ = auVar300._12_4_ * fVar237 + auVar87._12_4_ * fVar239 + auVar166._12_4_ * fVar190
  ;
  auVar300 = vsubps_avx(_local_3b8,(undefined1  [16])aVar7);
  auVar166 = vshufps_avx(auVar300,auVar300,0xaa);
  auVar87 = vmovshdup_avx(auVar300);
  auVar300 = vmovsldup_avx(auVar300);
  auVar289._0_8_ =
       CONCAT44(auVar300._4_4_ * fVar224 + auVar87._4_4_ * fVar238 + auVar166._4_4_ * fVar186,
                auVar300._0_4_ * fVar193 + auVar87._0_4_ * fVar218 + auVar166._0_4_ * fVar170);
  auVar289._8_4_ = auVar300._8_4_ * fVar215 + auVar87._8_4_ * fVar221 + auVar166._8_4_ * fVar188;
  auVar289._12_4_ = auVar300._12_4_ * fVar237 + auVar87._12_4_ * fVar239 + auVar166._12_4_ * fVar190
  ;
  auVar300 = vsubps_avx(_local_3c8,(undefined1  [16])aVar7);
  auVar166 = vshufps_avx(auVar300,auVar300,0xaa);
  auVar87 = vmovshdup_avx(auVar300);
  auVar300 = vmovsldup_avx(auVar300);
  auVar302._0_8_ =
       CONCAT44(auVar300._4_4_ * fVar224 + auVar87._4_4_ * fVar238 + auVar166._4_4_ * fVar186,
                auVar300._0_4_ * fVar193 + auVar87._0_4_ * fVar218 + auVar166._0_4_ * fVar170);
  auVar302._8_4_ = auVar300._8_4_ * fVar215 + auVar87._8_4_ * fVar221 + auVar166._8_4_ * fVar188;
  auVar302._12_4_ = auVar300._12_4_ * fVar237 + auVar87._12_4_ * fVar239 + auVar166._12_4_ * fVar190
  ;
  auVar300 = vsubps_avx(_local_2b8,(undefined1  [16])aVar7);
  auVar166 = vshufps_avx(auVar300,auVar300,0xaa);
  auVar87 = vmovshdup_avx(auVar300);
  auVar300 = vmovsldup_avx(auVar300);
  auVar82._0_8_ =
       CONCAT44(fVar224 * auVar300._4_4_ + auVar87._4_4_ * fVar238 + auVar166._4_4_ * fVar186,
                fVar193 * auVar300._0_4_ + auVar87._0_4_ * fVar218 + auVar166._0_4_ * fVar170);
  auVar82._8_4_ = fVar215 * auVar300._8_4_ + auVar87._8_4_ * fVar221 + auVar166._8_4_ * fVar188;
  auVar82._12_4_ = fVar237 * auVar300._12_4_ + auVar87._12_4_ * fVar239 + auVar166._12_4_ * fVar190;
  auVar274 = vmovlhps_avx(_local_4e8,auVar277);
  _local_418 = vmovlhps_avx(auVar115,auVar289);
  _local_428 = vmovlhps_avx(auVar180,auVar302);
  _local_1f8 = vmovlhps_avx(auVar260,auVar82);
  auVar87 = vminps_avx(auVar274,_local_418);
  auVar300 = vminps_avx(_local_428,_local_1f8);
  auVar166 = vminps_avx(auVar87,auVar300);
  auVar87 = vmaxps_avx(auVar274,_local_418);
  auVar300 = vmaxps_avx(_local_428,_local_1f8);
  auVar87 = vmaxps_avx(auVar87,auVar300);
  auVar300 = vshufpd_avx(auVar166,auVar166,3);
  auVar166 = vminps_avx(auVar166,auVar300);
  auVar300 = vshufpd_avx(auVar87,auVar87,3);
  auVar300 = vmaxps_avx(auVar87,auVar300);
  auVar248._8_4_ = 0x7fffffff;
  auVar248._0_8_ = 0x7fffffff7fffffff;
  auVar248._12_4_ = 0x7fffffff;
  auVar87 = vandps_avx(auVar166,auVar248);
  auVar300 = vandps_avx(auVar300,auVar248);
  auVar87 = vmaxps_avx(auVar87,auVar300);
  auVar300 = vmovshdup_avx(auVar87);
  auVar87 = vmaxss_avx(auVar300,auVar87);
  fVar193 = auVar87._0_4_ * 9.536743e-07;
  local_438._8_8_ = local_4e8;
  local_438._0_8_ = local_4e8;
  auVar253 = ZEXT1664(local_438);
  local_448._8_8_ = auVar115._0_8_;
  local_448._0_8_ = auVar115._0_8_;
  auVar332 = ZEXT1664(local_448);
  local_328._8_8_ = auVar180._0_8_;
  local_328._0_8_ = auVar180._0_8_;
  local_338._8_8_ = auVar260._0_8_;
  local_338._0_8_ = auVar260._0_8_;
  auVar265 = ZEXT1664(local_328);
  auVar283 = ZEXT1664(local_338);
  local_348._8_8_ = auVar289._0_8_;
  local_348._0_8_ = auVar289._0_8_;
  auVar294 = ZEXT1664(local_348);
  local_358._8_8_ = auVar302._0_8_;
  local_358._0_8_ = auVar302._0_8_;
  auVar308 = ZEXT1664(local_358);
  local_368._8_8_ = auVar82._0_8_;
  local_368._0_8_ = auVar82._0_8_;
  local_208 = ZEXT416((uint)fVar193);
  auVar87 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
  local_78._16_16_ = auVar87;
  local_78._0_16_ = auVar87;
  auVar83._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
  auVar83._8_4_ = auVar87._8_4_ ^ 0x80000000;
  auVar83._12_4_ = auVar87._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar83;
  local_98._0_16_ = auVar83;
  bVar67 = false;
  uVar60 = 0;
  _local_1c8 = vsubps_avx(_local_418,auVar274);
  auVar315 = ZEXT1664(local_368);
  _local_1d8 = vsubps_avx(_local_428,_local_418);
  _local_1e8 = vsubps_avx(_local_1f8,_local_428);
  _local_238 = vsubps_avx(_local_3a8,_local_378);
  _local_248 = vsubps_avx(_local_3b8,_local_388);
  _local_258 = vsubps_avx(_local_3c8,_local_398);
  auVar57._4_4_ = fStack_3f4;
  auVar57._0_4_ = local_3f8;
  auVar57._8_4_ = fStack_3f0;
  auVar57._12_4_ = fStack_3ec;
  _local_268 = vsubps_avx(_local_2b8,auVar57);
  auVar322 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar344 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_009466f0:
  local_218 = auVar344._0_16_;
  auVar319 = auVar322._0_16_;
  auVar87 = vshufps_avx(auVar319,auVar319,0x50);
  auVar336._8_4_ = 0x3f800000;
  auVar336._0_8_ = 0x3f8000003f800000;
  auVar336._12_4_ = 0x3f800000;
  auVar339._16_4_ = 0x3f800000;
  auVar339._0_16_ = auVar336;
  auVar339._20_4_ = 0x3f800000;
  auVar339._24_4_ = 0x3f800000;
  auVar339._28_4_ = 0x3f800000;
  auVar300 = vsubps_avx(auVar336,auVar87);
  fVar193 = auVar87._0_4_;
  fVar224 = auVar87._4_4_;
  fVar215 = auVar87._8_4_;
  fVar237 = auVar87._12_4_;
  fVar218 = auVar300._0_4_;
  fVar238 = auVar300._4_4_;
  fVar221 = auVar300._8_4_;
  fVar239 = auVar300._12_4_;
  auVar181._0_4_ = auVar277._0_4_ * fVar193 + fVar218 * auVar253._0_4_;
  auVar181._4_4_ = auVar277._4_4_ * fVar224 + fVar238 * auVar253._4_4_;
  auVar181._8_4_ = auVar277._0_4_ * fVar215 + fVar221 * auVar253._8_4_;
  auVar181._12_4_ = auVar277._4_4_ * fVar237 + fVar239 * auVar253._12_4_;
  auVar149._0_4_ = auVar294._0_4_ * fVar193 + auVar332._0_4_ * fVar218;
  auVar149._4_4_ = auVar294._4_4_ * fVar224 + auVar332._4_4_ * fVar238;
  auVar149._8_4_ = auVar294._8_4_ * fVar215 + auVar332._8_4_ * fVar221;
  auVar149._12_4_ = auVar294._12_4_ * fVar237 + auVar332._12_4_ * fVar239;
  auVar261._0_4_ = auVar308._0_4_ * fVar193 + fVar218 * auVar265._0_4_;
  auVar261._4_4_ = auVar308._4_4_ * fVar224 + fVar238 * auVar265._4_4_;
  auVar261._8_4_ = auVar308._8_4_ * fVar215 + fVar221 * auVar265._8_4_;
  auVar261._12_4_ = auVar308._12_4_ * fVar237 + fVar239 * auVar265._12_4_;
  auVar203._0_4_ = auVar315._0_4_ * fVar193 + auVar283._0_4_ * fVar218;
  auVar203._4_4_ = auVar315._4_4_ * fVar224 + auVar283._4_4_ * fVar238;
  auVar203._8_4_ = auVar315._8_4_ * fVar215 + auVar283._8_4_ * fVar221;
  auVar203._12_4_ = auVar315._12_4_ * fVar237 + auVar283._12_4_ * fVar239;
  auVar87 = vmovshdup_avx(local_218);
  auVar300 = vshufps_avx(local_218,local_218,0);
  auVar292._16_16_ = auVar300;
  auVar292._0_16_ = auVar300;
  auVar166 = vshufps_avx(local_218,local_218,0x55);
  auVar99._16_16_ = auVar166;
  auVar99._0_16_ = auVar166;
  auVar135 = vsubps_avx(auVar99,auVar292);
  auVar166 = vshufps_avx(auVar181,auVar181,0);
  auVar130 = vshufps_avx(auVar181,auVar181,0x55);
  auVar118 = vshufps_avx(auVar149,auVar149,0);
  auVar152 = vshufps_avx(auVar149,auVar149,0x55);
  auVar119 = vshufps_avx(auVar261,auVar261,0);
  auVar255 = vshufps_avx(auVar261,auVar261,0x55);
  auVar273 = vshufps_avx(auVar203,auVar203,0);
  auVar15 = vshufps_avx(auVar203,auVar203,0x55);
  auVar87 = ZEXT416((uint)((auVar87._0_4_ - auVar344._0_4_) * 0.04761905));
  auVar87 = vshufps_avx(auVar87,auVar87,0);
  auVar307._0_4_ = auVar300._0_4_ + auVar135._0_4_ * 0.0;
  auVar307._4_4_ = auVar300._4_4_ + auVar135._4_4_ * 0.14285715;
  auVar307._8_4_ = auVar300._8_4_ + auVar135._8_4_ * 0.2857143;
  auVar307._12_4_ = auVar300._12_4_ + auVar135._12_4_ * 0.42857146;
  auVar307._16_4_ = auVar300._0_4_ + auVar135._16_4_ * 0.5714286;
  auVar307._20_4_ = auVar300._4_4_ + auVar135._20_4_ * 0.71428573;
  auVar307._24_4_ = auVar300._8_4_ + auVar135._24_4_ * 0.8571429;
  auVar307._28_4_ = auVar300._12_4_ + auVar135._28_4_;
  auVar16 = vsubps_avx(auVar339,auVar307);
  fVar193 = auVar118._0_4_;
  fVar215 = auVar118._4_4_;
  fVar218 = auVar118._8_4_;
  fVar221 = auVar118._12_4_;
  fVar285 = auVar16._0_4_;
  fVar195 = auVar16._4_4_;
  fVar217 = auVar16._8_4_;
  fVar220 = auVar16._12_4_;
  fVar223 = auVar16._16_4_;
  fVar241 = auVar16._20_4_;
  fVar254 = auVar16._24_4_;
  fVar191 = auVar152._0_4_;
  fVar216 = auVar152._4_4_;
  fVar222 = auVar152._8_4_;
  fVar284 = auVar152._12_4_;
  fVar333 = auVar130._12_4_ + 1.0;
  fVar240 = auVar119._0_4_;
  fVar171 = auVar119._4_4_;
  fVar187 = auVar119._8_4_;
  fVar189 = auVar119._12_4_;
  fVar170 = fVar240 * auVar307._0_4_ + fVar285 * fVar193;
  fVar186 = fVar171 * auVar307._4_4_ + fVar195 * fVar215;
  fVar188 = fVar187 * auVar307._8_4_ + fVar217 * fVar218;
  fVar190 = fVar189 * auVar307._12_4_ + fVar220 * fVar221;
  fVar104 = fVar240 * auVar307._16_4_ + fVar223 * fVar193;
  fVar105 = fVar171 * auVar307._20_4_ + fVar241 * fVar215;
  fVar106 = fVar187 * auVar307._24_4_ + fVar254 * fVar218;
  fVar224 = auVar255._0_4_;
  fVar237 = auVar255._4_4_;
  fVar238 = auVar255._8_4_;
  fVar239 = auVar255._12_4_;
  fVar194 = fVar191 * fVar285 + auVar307._0_4_ * fVar224;
  fVar219 = fVar216 * fVar195 + auVar307._4_4_ * fVar237;
  fVar323 = fVar222 * fVar217 + auVar307._8_4_ * fVar238;
  fVar324 = fVar284 * fVar220 + auVar307._12_4_ * fVar239;
  fVar325 = fVar191 * fVar223 + auVar307._16_4_ * fVar224;
  fVar326 = fVar216 * fVar241 + auVar307._20_4_ * fVar237;
  fVar327 = fVar222 * fVar254 + auVar307._24_4_ * fVar238;
  fVar328 = fVar284 + fVar221;
  auVar300 = vshufps_avx(auVar181,auVar181,0xaa);
  auVar118 = vshufps_avx(auVar181,auVar181,0xff);
  fVar192 = fVar189 + 0.0;
  auVar152 = vshufps_avx(auVar149,auVar149,0xaa);
  auVar119 = vshufps_avx(auVar149,auVar149,0xff);
  auVar213._0_4_ =
       fVar285 * (auVar307._0_4_ * fVar193 + fVar285 * auVar166._0_4_) + auVar307._0_4_ * fVar170;
  auVar213._4_4_ =
       fVar195 * (auVar307._4_4_ * fVar215 + fVar195 * auVar166._4_4_) + auVar307._4_4_ * fVar186;
  auVar213._8_4_ =
       fVar217 * (auVar307._8_4_ * fVar218 + fVar217 * auVar166._8_4_) + auVar307._8_4_ * fVar188;
  auVar213._12_4_ =
       fVar220 * (auVar307._12_4_ * fVar221 + fVar220 * auVar166._12_4_) + auVar307._12_4_ * fVar190
  ;
  auVar213._16_4_ =
       fVar223 * (auVar307._16_4_ * fVar193 + fVar223 * auVar166._0_4_) + auVar307._16_4_ * fVar104;
  auVar213._20_4_ =
       fVar241 * (auVar307._20_4_ * fVar215 + fVar241 * auVar166._4_4_) + auVar307._20_4_ * fVar105;
  auVar213._24_4_ =
       fVar254 * (auVar307._24_4_ * fVar218 + fVar254 * auVar166._8_4_) + auVar307._24_4_ * fVar106;
  auVar213._28_4_ = auVar166._12_4_ + 1.0 + fVar239;
  auVar235._0_4_ =
       fVar285 * (fVar191 * auVar307._0_4_ + auVar130._0_4_ * fVar285) + auVar307._0_4_ * fVar194;
  auVar235._4_4_ =
       fVar195 * (fVar216 * auVar307._4_4_ + auVar130._4_4_ * fVar195) + auVar307._4_4_ * fVar219;
  auVar235._8_4_ =
       fVar217 * (fVar222 * auVar307._8_4_ + auVar130._8_4_ * fVar217) + auVar307._8_4_ * fVar323;
  auVar235._12_4_ =
       fVar220 * (fVar284 * auVar307._12_4_ + auVar130._12_4_ * fVar220) + auVar307._12_4_ * fVar324
  ;
  auVar235._16_4_ =
       fVar223 * (fVar191 * auVar307._16_4_ + auVar130._0_4_ * fVar223) + auVar307._16_4_ * fVar325;
  auVar235._20_4_ =
       fVar241 * (fVar216 * auVar307._20_4_ + auVar130._4_4_ * fVar241) + auVar307._20_4_ * fVar326;
  auVar235._24_4_ =
       fVar254 * (fVar222 * auVar307._24_4_ + auVar130._8_4_ * fVar254) + auVar307._24_4_ * fVar327;
  auVar235._28_4_ = auVar15._12_4_ + fVar239;
  auVar100._0_4_ =
       fVar285 * fVar170 + auVar307._0_4_ * (fVar240 * fVar285 + auVar273._0_4_ * auVar307._0_4_);
  auVar100._4_4_ =
       fVar195 * fVar186 + auVar307._4_4_ * (fVar171 * fVar195 + auVar273._4_4_ * auVar307._4_4_);
  auVar100._8_4_ =
       fVar217 * fVar188 + auVar307._8_4_ * (fVar187 * fVar217 + auVar273._8_4_ * auVar307._8_4_);
  auVar100._12_4_ =
       fVar220 * fVar190 + auVar307._12_4_ * (fVar189 * fVar220 + auVar273._12_4_ * auVar307._12_4_)
  ;
  auVar100._16_4_ =
       fVar223 * fVar104 + auVar307._16_4_ * (fVar240 * fVar223 + auVar273._0_4_ * auVar307._16_4_);
  auVar100._20_4_ =
       fVar241 * fVar105 + auVar307._20_4_ * (fVar171 * fVar241 + auVar273._4_4_ * auVar307._20_4_);
  auVar100._24_4_ =
       fVar254 * fVar106 + auVar307._24_4_ * (fVar187 * fVar254 + auVar273._8_4_ * auVar307._24_4_);
  auVar100._28_4_ = fVar221 + 1.0 + fVar192;
  auVar314._0_4_ =
       fVar285 * fVar194 + auVar307._0_4_ * (auVar15._0_4_ * auVar307._0_4_ + fVar285 * fVar224);
  auVar314._4_4_ =
       fVar195 * fVar219 + auVar307._4_4_ * (auVar15._4_4_ * auVar307._4_4_ + fVar195 * fVar237);
  auVar314._8_4_ =
       fVar217 * fVar323 + auVar307._8_4_ * (auVar15._8_4_ * auVar307._8_4_ + fVar217 * fVar238);
  auVar314._12_4_ =
       fVar220 * fVar324 + auVar307._12_4_ * (auVar15._12_4_ * auVar307._12_4_ + fVar220 * fVar239);
  auVar314._16_4_ =
       fVar223 * fVar325 + auVar307._16_4_ * (auVar15._0_4_ * auVar307._16_4_ + fVar223 * fVar224);
  auVar314._20_4_ =
       fVar241 * fVar326 + auVar307._20_4_ * (auVar15._4_4_ * auVar307._20_4_ + fVar241 * fVar237);
  auVar314._24_4_ =
       fVar254 * fVar327 + auVar307._24_4_ * (auVar15._8_4_ * auVar307._24_4_ + fVar254 * fVar238);
  auVar314._28_4_ = fVar192 + fVar239 + 0.0;
  local_d8._0_4_ = fVar285 * auVar213._0_4_ + auVar307._0_4_ * auVar100._0_4_;
  local_d8._4_4_ = fVar195 * auVar213._4_4_ + auVar307._4_4_ * auVar100._4_4_;
  local_d8._8_4_ = fVar217 * auVar213._8_4_ + auVar307._8_4_ * auVar100._8_4_;
  local_d8._12_4_ = fVar220 * auVar213._12_4_ + auVar307._12_4_ * auVar100._12_4_;
  local_d8._16_4_ = fVar223 * auVar213._16_4_ + auVar307._16_4_ * auVar100._16_4_;
  local_d8._20_4_ = fVar241 * auVar213._20_4_ + auVar307._20_4_ * auVar100._20_4_;
  local_d8._24_4_ = fVar254 * auVar213._24_4_ + auVar307._24_4_ * auVar100._24_4_;
  local_d8._28_4_ = fVar328 + fVar239 + 0.0;
  auVar185._0_4_ = fVar285 * auVar235._0_4_ + auVar307._0_4_ * auVar314._0_4_;
  auVar185._4_4_ = fVar195 * auVar235._4_4_ + auVar307._4_4_ * auVar314._4_4_;
  auVar185._8_4_ = fVar217 * auVar235._8_4_ + auVar307._8_4_ * auVar314._8_4_;
  auVar185._12_4_ = fVar220 * auVar235._12_4_ + auVar307._12_4_ * auVar314._12_4_;
  auVar185._16_4_ = fVar223 * auVar235._16_4_ + auVar307._16_4_ * auVar314._16_4_;
  auVar185._20_4_ = fVar241 * auVar235._20_4_ + auVar307._20_4_ * auVar314._20_4_;
  auVar185._24_4_ = fVar254 * auVar235._24_4_ + auVar307._24_4_ * auVar314._24_4_;
  auVar185._28_4_ = fVar328 + fVar192;
  auVar17 = vsubps_avx(auVar100,auVar213);
  auVar135 = vsubps_avx(auVar314,auVar235);
  local_3e8._0_4_ = auVar87._0_4_;
  local_3e8._4_4_ = auVar87._4_4_;
  fStack_3e0 = auVar87._8_4_;
  fStack_3dc = auVar87._12_4_;
  local_118 = (float)local_3e8._0_4_ * auVar17._0_4_ * 3.0;
  fStack_114 = (float)local_3e8._4_4_ * auVar17._4_4_ * 3.0;
  auVar18._4_4_ = fStack_114;
  auVar18._0_4_ = local_118;
  fStack_110 = fStack_3e0 * auVar17._8_4_ * 3.0;
  auVar18._8_4_ = fStack_110;
  fStack_10c = fStack_3dc * auVar17._12_4_ * 3.0;
  auVar18._12_4_ = fStack_10c;
  fStack_108 = (float)local_3e8._0_4_ * auVar17._16_4_ * 3.0;
  auVar18._16_4_ = fStack_108;
  fStack_104 = (float)local_3e8._4_4_ * auVar17._20_4_ * 3.0;
  auVar18._20_4_ = fStack_104;
  fStack_100 = fStack_3e0 * auVar17._24_4_ * 3.0;
  auVar18._24_4_ = fStack_100;
  auVar18._28_4_ = auVar17._28_4_;
  local_138 = (float)local_3e8._0_4_ * auVar135._0_4_ * 3.0;
  fStack_134 = (float)local_3e8._4_4_ * auVar135._4_4_ * 3.0;
  auVar19._4_4_ = fStack_134;
  auVar19._0_4_ = local_138;
  fStack_130 = fStack_3e0 * auVar135._8_4_ * 3.0;
  auVar19._8_4_ = fStack_130;
  fStack_12c = fStack_3dc * auVar135._12_4_ * 3.0;
  auVar19._12_4_ = fStack_12c;
  fStack_128 = (float)local_3e8._0_4_ * auVar135._16_4_ * 3.0;
  auVar19._16_4_ = fStack_128;
  fStack_124 = (float)local_3e8._4_4_ * auVar135._20_4_ * 3.0;
  auVar19._20_4_ = fStack_124;
  fStack_120 = fStack_3e0 * auVar135._24_4_ * 3.0;
  auVar19._24_4_ = fStack_120;
  auVar19._28_4_ = fVar328;
  auVar18 = vsubps_avx(local_d8,auVar18);
  auVar135 = vperm2f128_avx(auVar18,auVar18,1);
  auVar135 = vshufps_avx(auVar135,auVar18,0x30);
  auVar135 = vshufps_avx(auVar18,auVar135,0x29);
  auVar19 = vsubps_avx(auVar185,auVar19);
  auVar18 = vperm2f128_avx(auVar19,auVar19,1);
  auVar18 = vshufps_avx(auVar18,auVar19,0x30);
  _local_488 = vshufps_avx(auVar19,auVar18,0x29);
  fVar326 = auVar152._0_4_;
  fVar327 = auVar152._4_4_;
  fVar345 = auVar152._8_4_;
  fVar221 = auVar300._12_4_;
  fVar171 = auVar119._0_4_;
  fVar189 = auVar119._4_4_;
  fVar194 = auVar119._8_4_;
  fVar219 = auVar119._12_4_;
  auVar87 = vshufps_avx(auVar261,auVar261,0xaa);
  fVar193 = auVar87._0_4_;
  fVar215 = auVar87._4_4_;
  fVar218 = auVar87._8_4_;
  fVar239 = auVar87._12_4_;
  fVar188 = auVar307._0_4_ * fVar193 + fVar326 * fVar285;
  fVar190 = auVar307._4_4_ * fVar215 + fVar327 * fVar195;
  fVar104 = auVar307._8_4_ * fVar218 + fVar345 * fVar217;
  fVar105 = auVar307._12_4_ * fVar239 + auVar152._12_4_ * fVar220;
  fVar106 = auVar307._16_4_ * fVar193 + fVar326 * fVar223;
  fVar192 = auVar307._20_4_ * fVar215 + fVar327 * fVar241;
  fVar240 = auVar307._24_4_ * fVar218 + fVar345 * fVar254;
  auVar87 = vshufps_avx(auVar261,auVar261,0xff);
  fVar224 = auVar87._0_4_;
  fVar237 = auVar87._4_4_;
  fVar238 = auVar87._8_4_;
  fVar170 = auVar87._12_4_;
  fVar187 = auVar307._0_4_ * fVar224 + fVar171 * fVar285;
  fVar191 = auVar307._4_4_ * fVar237 + fVar189 * fVar195;
  fVar216 = auVar307._8_4_ * fVar238 + fVar194 * fVar217;
  fVar222 = auVar307._12_4_ * fVar170 + fVar219 * fVar220;
  fVar323 = auVar307._16_4_ * fVar224 + fVar171 * fVar223;
  fVar284 = auVar307._20_4_ * fVar237 + fVar189 * fVar241;
  fVar324 = auVar307._24_4_ * fVar238 + fVar194 * fVar254;
  auVar87 = vshufps_avx(auVar203,auVar203,0xaa);
  fVar325 = auVar87._12_4_ + fVar239;
  auVar166 = vshufps_avx(auVar203,auVar203,0xff);
  fVar186 = auVar166._12_4_;
  auVar101._0_4_ =
       fVar285 * (fVar326 * auVar307._0_4_ + fVar285 * auVar300._0_4_) + auVar307._0_4_ * fVar188;
  auVar101._4_4_ =
       fVar195 * (fVar327 * auVar307._4_4_ + fVar195 * auVar300._4_4_) + auVar307._4_4_ * fVar190;
  auVar101._8_4_ =
       fVar217 * (fVar345 * auVar307._8_4_ + fVar217 * auVar300._8_4_) + auVar307._8_4_ * fVar104;
  auVar101._12_4_ =
       fVar220 * (auVar152._12_4_ * auVar307._12_4_ + fVar220 * fVar221) + auVar307._12_4_ * fVar105
  ;
  auVar101._16_4_ =
       fVar223 * (fVar326 * auVar307._16_4_ + fVar223 * auVar300._0_4_) + auVar307._16_4_ * fVar106;
  auVar101._20_4_ =
       fVar241 * (fVar327 * auVar307._20_4_ + fVar241 * auVar300._4_4_) + auVar307._20_4_ * fVar192;
  auVar101._24_4_ =
       fVar254 * (fVar345 * auVar307._24_4_ + fVar254 * auVar300._8_4_) + auVar307._24_4_ * fVar240;
  auVar101._28_4_ = local_488._28_4_ + fVar221 + fVar186;
  auVar136._0_4_ =
       fVar285 * (fVar171 * auVar307._0_4_ + auVar118._0_4_ * fVar285) + auVar307._0_4_ * fVar187;
  auVar136._4_4_ =
       fVar195 * (fVar189 * auVar307._4_4_ + auVar118._4_4_ * fVar195) + auVar307._4_4_ * fVar191;
  auVar136._8_4_ =
       fVar217 * (fVar194 * auVar307._8_4_ + auVar118._8_4_ * fVar217) + auVar307._8_4_ * fVar216;
  auVar136._12_4_ =
       fVar220 * (fVar219 * auVar307._12_4_ + auVar118._12_4_ * fVar220) + auVar307._12_4_ * fVar222
  ;
  auVar136._16_4_ =
       fVar223 * (fVar171 * auVar307._16_4_ + auVar118._0_4_ * fVar223) + auVar307._16_4_ * fVar323;
  auVar136._20_4_ =
       fVar241 * (fVar189 * auVar307._20_4_ + auVar118._4_4_ * fVar241) + auVar307._20_4_ * fVar284;
  auVar136._24_4_ =
       fVar254 * (fVar194 * auVar307._24_4_ + auVar118._8_4_ * fVar254) + auVar307._24_4_ * fVar324;
  auVar136._28_4_ = fVar221 + auVar18._28_4_ + fVar186;
  auVar18 = vperm2f128_avx(local_d8,local_d8,1);
  auVar18 = vshufps_avx(auVar18,local_d8,0x30);
  _local_318 = vshufps_avx(local_d8,auVar18,0x29);
  auVar236._0_4_ =
       auVar307._0_4_ * (auVar87._0_4_ * auVar307._0_4_ + fVar285 * fVar193) + fVar285 * fVar188;
  auVar236._4_4_ =
       auVar307._4_4_ * (auVar87._4_4_ * auVar307._4_4_ + fVar195 * fVar215) + fVar195 * fVar190;
  auVar236._8_4_ =
       auVar307._8_4_ * (auVar87._8_4_ * auVar307._8_4_ + fVar217 * fVar218) + fVar217 * fVar104;
  auVar236._12_4_ =
       auVar307._12_4_ * (auVar87._12_4_ * auVar307._12_4_ + fVar220 * fVar239) + fVar220 * fVar105;
  auVar236._16_4_ =
       auVar307._16_4_ * (auVar87._0_4_ * auVar307._16_4_ + fVar223 * fVar193) + fVar223 * fVar106;
  auVar236._20_4_ =
       auVar307._20_4_ * (auVar87._4_4_ * auVar307._20_4_ + fVar241 * fVar215) + fVar241 * fVar192;
  auVar236._24_4_ =
       auVar307._24_4_ * (auVar87._8_4_ * auVar307._24_4_ + fVar254 * fVar218) + fVar254 * fVar240;
  auVar236._28_4_ = fVar325 + fVar333 + auVar235._28_4_;
  auVar282._0_4_ =
       fVar285 * fVar187 + auVar307._0_4_ * (auVar307._0_4_ * auVar166._0_4_ + fVar285 * fVar224);
  auVar282._4_4_ =
       fVar195 * fVar191 + auVar307._4_4_ * (auVar307._4_4_ * auVar166._4_4_ + fVar195 * fVar237);
  auVar282._8_4_ =
       fVar217 * fVar216 + auVar307._8_4_ * (auVar307._8_4_ * auVar166._8_4_ + fVar217 * fVar238);
  auVar282._12_4_ =
       fVar220 * fVar222 + auVar307._12_4_ * (auVar307._12_4_ * fVar186 + fVar220 * fVar170);
  auVar282._16_4_ =
       fVar223 * fVar323 + auVar307._16_4_ * (auVar307._16_4_ * auVar166._0_4_ + fVar223 * fVar224);
  auVar282._20_4_ =
       fVar241 * fVar284 + auVar307._20_4_ * (auVar307._20_4_ * auVar166._4_4_ + fVar241 * fVar237);
  auVar282._24_4_ =
       fVar254 * fVar324 + auVar307._24_4_ * (auVar307._24_4_ * auVar166._8_4_ + fVar254 * fVar238);
  auVar282._28_4_ = fVar333 + fVar219 + fVar186 + fVar170;
  auVar264._0_4_ = fVar285 * auVar101._0_4_ + auVar307._0_4_ * auVar236._0_4_;
  auVar264._4_4_ = fVar195 * auVar101._4_4_ + auVar307._4_4_ * auVar236._4_4_;
  auVar264._8_4_ = fVar217 * auVar101._8_4_ + auVar307._8_4_ * auVar236._8_4_;
  auVar264._12_4_ = fVar220 * auVar101._12_4_ + auVar307._12_4_ * auVar236._12_4_;
  auVar264._16_4_ = fVar223 * auVar101._16_4_ + auVar307._16_4_ * auVar236._16_4_;
  auVar264._20_4_ = fVar241 * auVar101._20_4_ + auVar307._20_4_ * auVar236._20_4_;
  auVar264._24_4_ = fVar254 * auVar101._24_4_ + auVar307._24_4_ * auVar236._24_4_;
  auVar264._28_4_ = fVar325 + fVar186 + fVar170;
  auVar293._0_4_ = fVar285 * auVar136._0_4_ + auVar307._0_4_ * auVar282._0_4_;
  auVar293._4_4_ = fVar195 * auVar136._4_4_ + auVar307._4_4_ * auVar282._4_4_;
  auVar293._8_4_ = fVar217 * auVar136._8_4_ + auVar307._8_4_ * auVar282._8_4_;
  auVar293._12_4_ = fVar220 * auVar136._12_4_ + auVar307._12_4_ * auVar282._12_4_;
  auVar293._16_4_ = fVar223 * auVar136._16_4_ + auVar307._16_4_ * auVar282._16_4_;
  auVar293._20_4_ = fVar241 * auVar136._20_4_ + auVar307._20_4_ * auVar282._20_4_;
  auVar293._24_4_ = fVar254 * auVar136._24_4_ + auVar307._24_4_ * auVar282._24_4_;
  auVar293._28_4_ = auVar16._28_4_ + auVar307._28_4_;
  auVar16 = vsubps_avx(auVar236,auVar101);
  auVar18 = vsubps_avx(auVar282,auVar136);
  local_158 = (float)local_3e8._0_4_ * auVar16._0_4_ * 3.0;
  fStack_154 = (float)local_3e8._4_4_ * auVar16._4_4_ * 3.0;
  auVar20._4_4_ = fStack_154;
  auVar20._0_4_ = local_158;
  fStack_150 = fStack_3e0 * auVar16._8_4_ * 3.0;
  auVar20._8_4_ = fStack_150;
  fStack_14c = fStack_3dc * auVar16._12_4_ * 3.0;
  auVar20._12_4_ = fStack_14c;
  fStack_148 = (float)local_3e8._0_4_ * auVar16._16_4_ * 3.0;
  auVar20._16_4_ = fStack_148;
  fStack_144 = (float)local_3e8._4_4_ * auVar16._20_4_ * 3.0;
  auVar20._20_4_ = fStack_144;
  fStack_140 = fStack_3e0 * auVar16._24_4_ * 3.0;
  auVar20._24_4_ = fStack_140;
  auVar20._28_4_ = auVar16._28_4_;
  local_178 = (float)local_3e8._0_4_ * auVar18._0_4_ * 3.0;
  fStack_174 = (float)local_3e8._4_4_ * auVar18._4_4_ * 3.0;
  auVar21._4_4_ = fStack_174;
  auVar21._0_4_ = local_178;
  fStack_170 = fStack_3e0 * auVar18._8_4_ * 3.0;
  auVar21._8_4_ = fStack_170;
  fStack_16c = fStack_3dc * auVar18._12_4_ * 3.0;
  auVar21._12_4_ = fStack_16c;
  fStack_168 = (float)local_3e8._0_4_ * auVar18._16_4_ * 3.0;
  auVar21._16_4_ = fStack_168;
  fStack_164 = (float)local_3e8._4_4_ * auVar18._20_4_ * 3.0;
  auVar21._20_4_ = fStack_164;
  fStack_160 = fStack_3e0 * auVar18._24_4_ * 3.0;
  auVar21._24_4_ = fStack_160;
  auVar21._28_4_ = auVar236._28_4_;
  auVar18 = vperm2f128_avx(auVar264,auVar264,1);
  auVar18 = vshufps_avx(auVar18,auVar264,0x30);
  auVar99 = vshufps_avx(auVar264,auVar18,0x29);
  auVar19 = vsubps_avx(auVar264,auVar20);
  auVar18 = vperm2f128_avx(auVar19,auVar19,1);
  auVar18 = vshufps_avx(auVar18,auVar19,0x30);
  _local_3e8 = vshufps_avx(auVar19,auVar18,0x29);
  auVar19 = vsubps_avx(auVar293,auVar21);
  auVar18 = vperm2f128_avx(auVar19,auVar19,1);
  auVar18 = vshufps_avx(auVar18,auVar19,0x30);
  local_b8 = vshufps_avx(auVar19,auVar18,0x29);
  auVar19 = vsubps_avx(auVar264,local_d8);
  auVar20 = vsubps_avx(auVar99,_local_318);
  fVar193 = auVar20._0_4_ + auVar19._0_4_;
  fVar224 = auVar20._4_4_ + auVar19._4_4_;
  fVar215 = auVar20._8_4_ + auVar19._8_4_;
  fVar237 = auVar20._12_4_ + auVar19._12_4_;
  fVar218 = auVar20._16_4_ + auVar19._16_4_;
  fVar238 = auVar20._20_4_ + auVar19._20_4_;
  fVar221 = auVar20._24_4_ + auVar19._24_4_;
  auVar18 = vperm2f128_avx(auVar185,auVar185,1);
  auVar18 = vshufps_avx(auVar18,auVar185,0x30);
  local_f8 = vshufps_avx(auVar185,auVar18,0x29);
  auVar18 = vperm2f128_avx(auVar293,auVar293,1);
  auVar18 = vshufps_avx(auVar18,auVar293,0x30);
  _local_468 = vshufps_avx(auVar293,auVar18,0x29);
  auVar18 = vsubps_avx(auVar293,auVar185);
  auVar21 = vsubps_avx(_local_468,local_f8);
  fVar239 = auVar21._0_4_ + auVar18._0_4_;
  fVar170 = auVar21._4_4_ + auVar18._4_4_;
  fVar186 = auVar21._8_4_ + auVar18._8_4_;
  fVar188 = auVar21._12_4_ + auVar18._12_4_;
  fVar190 = auVar21._16_4_ + auVar18._16_4_;
  fVar104 = auVar21._20_4_ + auVar18._20_4_;
  fVar105 = auVar21._24_4_ + auVar18._24_4_;
  auVar22._4_4_ = fVar224 * auVar185._4_4_;
  auVar22._0_4_ = fVar193 * auVar185._0_4_;
  auVar22._8_4_ = fVar215 * auVar185._8_4_;
  auVar22._12_4_ = fVar237 * auVar185._12_4_;
  auVar22._16_4_ = fVar218 * auVar185._16_4_;
  auVar22._20_4_ = fVar238 * auVar185._20_4_;
  auVar22._24_4_ = fVar221 * auVar185._24_4_;
  auVar22._28_4_ = auVar18._28_4_;
  auVar23._4_4_ = fVar170 * local_d8._4_4_;
  auVar23._0_4_ = fVar239 * local_d8._0_4_;
  auVar23._8_4_ = fVar186 * local_d8._8_4_;
  auVar23._12_4_ = fVar188 * local_d8._12_4_;
  auVar23._16_4_ = fVar190 * local_d8._16_4_;
  auVar23._20_4_ = fVar104 * local_d8._20_4_;
  auVar23._24_4_ = fVar105 * local_d8._24_4_;
  auVar23._28_4_ = fVar325;
  auVar22 = vsubps_avx(auVar22,auVar23);
  local_118 = local_d8._0_4_ + local_118;
  fStack_114 = local_d8._4_4_ + fStack_114;
  fStack_110 = local_d8._8_4_ + fStack_110;
  fStack_10c = local_d8._12_4_ + fStack_10c;
  fStack_108 = local_d8._16_4_ + fStack_108;
  fStack_104 = local_d8._20_4_ + fStack_104;
  fStack_100 = local_d8._24_4_ + fStack_100;
  fStack_fc = local_d8._28_4_ + auVar17._28_4_;
  local_138 = local_138 + auVar185._0_4_;
  fStack_134 = fStack_134 + auVar185._4_4_;
  fStack_130 = fStack_130 + auVar185._8_4_;
  fStack_12c = fStack_12c + auVar185._12_4_;
  fStack_128 = fStack_128 + auVar185._16_4_;
  fStack_124 = fStack_124 + auVar185._20_4_;
  fStack_120 = fStack_120 + auVar185._24_4_;
  fStack_11c = fVar328 + auVar185._28_4_;
  auVar17._4_4_ = fVar224 * fStack_134;
  auVar17._0_4_ = fVar193 * local_138;
  auVar17._8_4_ = fVar215 * fStack_130;
  auVar17._12_4_ = fVar237 * fStack_12c;
  auVar17._16_4_ = fVar218 * fStack_128;
  auVar17._20_4_ = fVar238 * fStack_124;
  auVar17._24_4_ = fVar221 * fStack_120;
  auVar17._28_4_ = fVar328;
  auVar24._4_4_ = fVar170 * fStack_114;
  auVar24._0_4_ = fVar239 * local_118;
  auVar24._8_4_ = fVar186 * fStack_110;
  auVar24._12_4_ = fVar188 * fStack_10c;
  auVar24._16_4_ = fVar190 * fStack_108;
  auVar24._20_4_ = fVar104 * fStack_104;
  auVar24._24_4_ = fVar105 * fStack_100;
  auVar24._28_4_ = fVar328 + auVar185._28_4_;
  auVar17 = vsubps_avx(auVar17,auVar24);
  auVar25._4_4_ = fVar224 * (float)local_488._4_4_;
  auVar25._0_4_ = fVar193 * (float)local_488._0_4_;
  auVar25._8_4_ = fVar215 * fStack_480;
  auVar25._12_4_ = fVar237 * fStack_47c;
  auVar25._16_4_ = fVar218 * fStack_478;
  auVar25._20_4_ = fVar238 * fStack_474;
  auVar25._24_4_ = fVar221 * fStack_470;
  auVar25._28_4_ = fVar328;
  local_4b8._0_4_ = auVar135._0_4_;
  local_4b8._4_4_ = auVar135._4_4_;
  fStack_4b0 = auVar135._8_4_;
  fStack_4ac = auVar135._12_4_;
  fStack_4a8 = auVar135._16_4_;
  fStack_4a4 = auVar135._20_4_;
  fStack_4a0 = auVar135._24_4_;
  auVar26._4_4_ = fVar170 * (float)local_4b8._4_4_;
  auVar26._0_4_ = fVar239 * (float)local_4b8._0_4_;
  auVar26._8_4_ = fVar186 * fStack_4b0;
  auVar26._12_4_ = fVar188 * fStack_4ac;
  auVar26._16_4_ = fVar190 * fStack_4a8;
  auVar26._20_4_ = fVar104 * fStack_4a4;
  auVar26._24_4_ = fVar105 * fStack_4a0;
  auVar26._28_4_ = local_d8._28_4_;
  auVar23 = vsubps_avx(auVar25,auVar26);
  auVar27._4_4_ = local_f8._4_4_ * fVar224;
  auVar27._0_4_ = local_f8._0_4_ * fVar193;
  auVar27._8_4_ = local_f8._8_4_ * fVar215;
  auVar27._12_4_ = local_f8._12_4_ * fVar237;
  auVar27._16_4_ = local_f8._16_4_ * fVar218;
  auVar27._20_4_ = local_f8._20_4_ * fVar238;
  auVar27._24_4_ = local_f8._24_4_ * fVar221;
  auVar27._28_4_ = fVar328;
  auVar28._4_4_ = local_318._4_4_ * fVar170;
  auVar28._0_4_ = local_318._0_4_ * fVar239;
  auVar28._8_4_ = local_318._8_4_ * fVar186;
  auVar28._12_4_ = local_318._12_4_ * fVar188;
  auVar28._16_4_ = local_318._16_4_ * fVar190;
  auVar28._20_4_ = local_318._20_4_ * fVar104;
  auVar28._24_4_ = local_318._24_4_ * fVar105;
  auVar28._28_4_ = local_f8._28_4_;
  auVar24 = vsubps_avx(auVar27,auVar28);
  auVar29._4_4_ = auVar293._4_4_ * fVar224;
  auVar29._0_4_ = auVar293._0_4_ * fVar193;
  auVar29._8_4_ = auVar293._8_4_ * fVar215;
  auVar29._12_4_ = auVar293._12_4_ * fVar237;
  auVar29._16_4_ = auVar293._16_4_ * fVar218;
  auVar29._20_4_ = auVar293._20_4_ * fVar238;
  auVar29._24_4_ = auVar293._24_4_ * fVar221;
  auVar29._28_4_ = fVar328;
  auVar30._4_4_ = fVar170 * auVar264._4_4_;
  auVar30._0_4_ = fVar239 * auVar264._0_4_;
  auVar30._8_4_ = fVar186 * auVar264._8_4_;
  auVar30._12_4_ = fVar188 * auVar264._12_4_;
  auVar30._16_4_ = fVar190 * auVar264._16_4_;
  auVar30._20_4_ = fVar104 * auVar264._20_4_;
  auVar30._24_4_ = fVar105 * auVar264._24_4_;
  auVar30._28_4_ = fStack_fc;
  auVar25 = vsubps_avx(auVar29,auVar30);
  local_158 = auVar264._0_4_ + local_158;
  fStack_154 = auVar264._4_4_ + fStack_154;
  fStack_150 = auVar264._8_4_ + fStack_150;
  fStack_14c = auVar264._12_4_ + fStack_14c;
  fStack_148 = auVar264._16_4_ + fStack_148;
  fStack_144 = auVar264._20_4_ + fStack_144;
  fStack_140 = auVar264._24_4_ + fStack_140;
  fStack_13c = auVar264._28_4_ + auVar16._28_4_;
  local_178 = auVar293._0_4_ + local_178;
  fStack_174 = auVar293._4_4_ + fStack_174;
  fStack_170 = auVar293._8_4_ + fStack_170;
  fStack_16c = auVar293._12_4_ + fStack_16c;
  fStack_168 = auVar293._16_4_ + fStack_168;
  fStack_164 = auVar293._20_4_ + fStack_164;
  fStack_160 = auVar293._24_4_ + fStack_160;
  fStack_15c = auVar293._28_4_ + auVar236._28_4_;
  auVar16._4_4_ = fVar224 * fStack_174;
  auVar16._0_4_ = fVar193 * local_178;
  auVar16._8_4_ = fVar215 * fStack_170;
  auVar16._12_4_ = fVar237 * fStack_16c;
  auVar16._16_4_ = fVar218 * fStack_168;
  auVar16._20_4_ = fVar238 * fStack_164;
  auVar16._24_4_ = fVar221 * fStack_160;
  auVar16._28_4_ = auVar293._28_4_ + auVar236._28_4_;
  auVar31._4_4_ = fStack_154 * fVar170;
  auVar31._0_4_ = local_158 * fVar239;
  auVar31._8_4_ = fStack_150 * fVar186;
  auVar31._12_4_ = fStack_14c * fVar188;
  auVar31._16_4_ = fStack_148 * fVar190;
  auVar31._20_4_ = fStack_144 * fVar104;
  auVar31._24_4_ = fStack_140 * fVar105;
  auVar31._28_4_ = fStack_13c;
  auVar26 = vsubps_avx(auVar16,auVar31);
  auVar32._4_4_ = fVar224 * local_b8._4_4_;
  auVar32._0_4_ = fVar193 * local_b8._0_4_;
  auVar32._8_4_ = fVar215 * local_b8._8_4_;
  auVar32._12_4_ = fVar237 * local_b8._12_4_;
  auVar32._16_4_ = fVar218 * local_b8._16_4_;
  auVar32._20_4_ = fVar238 * local_b8._20_4_;
  auVar32._24_4_ = fVar221 * local_b8._24_4_;
  auVar32._28_4_ = fStack_13c;
  auVar33._4_4_ = fVar170 * (float)local_3e8._4_4_;
  auVar33._0_4_ = fVar239 * (float)local_3e8._0_4_;
  auVar33._8_4_ = fVar186 * fStack_3e0;
  auVar33._12_4_ = fVar188 * fStack_3dc;
  auVar33._16_4_ = fVar190 * fStack_3d8;
  auVar33._20_4_ = fVar104 * fStack_3d4;
  auVar33._24_4_ = fVar105 * fStack_3d0;
  auVar33._28_4_ = local_b8._28_4_;
  auVar27 = vsubps_avx(auVar32,auVar33);
  auVar34._4_4_ = fVar224 * local_468._4_4_;
  auVar34._0_4_ = fVar193 * local_468._0_4_;
  auVar34._8_4_ = fVar215 * local_468._8_4_;
  auVar34._12_4_ = fVar237 * local_468._12_4_;
  auVar34._16_4_ = fVar218 * local_468._16_4_;
  auVar34._20_4_ = fVar238 * local_468._20_4_;
  auVar34._24_4_ = fVar221 * local_468._24_4_;
  auVar34._28_4_ = auVar20._28_4_ + auVar19._28_4_;
  auVar35._4_4_ = auVar99._4_4_ * fVar170;
  auVar35._0_4_ = auVar99._0_4_ * fVar239;
  auVar35._8_4_ = auVar99._8_4_ * fVar186;
  auVar35._12_4_ = auVar99._12_4_ * fVar188;
  auVar35._16_4_ = auVar99._16_4_ * fVar190;
  auVar35._20_4_ = auVar99._20_4_ * fVar104;
  auVar35._24_4_ = auVar99._24_4_ * fVar105;
  auVar35._28_4_ = auVar21._28_4_ + auVar18._28_4_;
  auVar20 = vsubps_avx(auVar34,auVar35);
  auVar18 = vminps_avx(auVar22,auVar17);
  auVar135 = vmaxps_avx(auVar22,auVar17);
  auVar16 = vminps_avx(auVar23,auVar24);
  auVar16 = vminps_avx(auVar18,auVar16);
  auVar18 = vmaxps_avx(auVar23,auVar24);
  auVar135 = vmaxps_avx(auVar135,auVar18);
  auVar17 = vminps_avx(auVar25,auVar26);
  auVar18 = vmaxps_avx(auVar25,auVar26);
  auVar19 = vminps_avx(auVar27,auVar20);
  auVar19 = vminps_avx(auVar17,auVar19);
  auVar19 = vminps_avx(auVar16,auVar19);
  auVar16 = vmaxps_avx(auVar27,auVar20);
  auVar18 = vmaxps_avx(auVar18,auVar16);
  auVar18 = vmaxps_avx(auVar135,auVar18);
  auVar135 = vcmpps_avx(auVar19,local_78,2);
  auVar18 = vcmpps_avx(auVar18,local_98,5);
  auVar135 = vandps_avx(auVar18,auVar135);
  auVar18 = local_198 & auVar135;
  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0x7f,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar18 >> 0xbf,0) != '\0') ||
      (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0') {
    auVar18 = vsubps_avx(_local_318,local_d8);
    auVar16 = vsubps_avx(auVar99,auVar264);
    fVar224 = auVar18._0_4_ + auVar16._0_4_;
    fVar215 = auVar18._4_4_ + auVar16._4_4_;
    fVar237 = auVar18._8_4_ + auVar16._8_4_;
    fVar218 = auVar18._12_4_ + auVar16._12_4_;
    fVar238 = auVar18._16_4_ + auVar16._16_4_;
    fVar221 = auVar18._20_4_ + auVar16._20_4_;
    fVar239 = auVar18._24_4_ + auVar16._24_4_;
    auVar19 = vsubps_avx(local_f8,auVar185);
    auVar20 = vsubps_avx(_local_468,auVar293);
    fVar170 = auVar19._0_4_ + auVar20._0_4_;
    fVar186 = auVar19._4_4_ + auVar20._4_4_;
    fVar188 = auVar19._8_4_ + auVar20._8_4_;
    fVar190 = auVar19._12_4_ + auVar20._12_4_;
    fVar104 = auVar19._16_4_ + auVar20._16_4_;
    fVar105 = auVar19._20_4_ + auVar20._20_4_;
    fVar106 = auVar19._24_4_ + auVar20._24_4_;
    fVar193 = auVar20._28_4_;
    auVar36._4_4_ = auVar185._4_4_ * fVar215;
    auVar36._0_4_ = auVar185._0_4_ * fVar224;
    auVar36._8_4_ = auVar185._8_4_ * fVar237;
    auVar36._12_4_ = auVar185._12_4_ * fVar218;
    auVar36._16_4_ = auVar185._16_4_ * fVar238;
    auVar36._20_4_ = auVar185._20_4_ * fVar221;
    auVar36._24_4_ = auVar185._24_4_ * fVar239;
    auVar36._28_4_ = auVar185._28_4_;
    auVar37._4_4_ = local_d8._4_4_ * fVar186;
    auVar37._0_4_ = local_d8._0_4_ * fVar170;
    auVar37._8_4_ = local_d8._8_4_ * fVar188;
    auVar37._12_4_ = local_d8._12_4_ * fVar190;
    auVar37._16_4_ = local_d8._16_4_ * fVar104;
    auVar37._20_4_ = local_d8._20_4_ * fVar105;
    auVar37._24_4_ = local_d8._24_4_ * fVar106;
    auVar37._28_4_ = local_d8._28_4_;
    auVar20 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = fVar215 * fStack_134;
    auVar38._0_4_ = fVar224 * local_138;
    auVar38._8_4_ = fVar237 * fStack_130;
    auVar38._12_4_ = fVar218 * fStack_12c;
    auVar38._16_4_ = fVar238 * fStack_128;
    auVar38._20_4_ = fVar221 * fStack_124;
    auVar38._24_4_ = fVar239 * fStack_120;
    auVar38._28_4_ = auVar185._28_4_;
    auVar39._4_4_ = fVar186 * fStack_114;
    auVar39._0_4_ = fVar170 * local_118;
    auVar39._8_4_ = fVar188 * fStack_110;
    auVar39._12_4_ = fVar190 * fStack_10c;
    auVar39._16_4_ = fVar104 * fStack_108;
    auVar39._20_4_ = fVar105 * fStack_104;
    auVar39._24_4_ = fVar106 * fStack_100;
    auVar39._28_4_ = fVar193;
    auVar21 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar215 * (float)local_488._4_4_;
    auVar40._0_4_ = fVar224 * (float)local_488._0_4_;
    auVar40._8_4_ = fVar237 * fStack_480;
    auVar40._12_4_ = fVar218 * fStack_47c;
    auVar40._16_4_ = fVar238 * fStack_478;
    auVar40._20_4_ = fVar221 * fStack_474;
    auVar40._24_4_ = fVar239 * fStack_470;
    auVar40._28_4_ = fVar193;
    auVar41._4_4_ = fVar186 * (float)local_4b8._4_4_;
    auVar41._0_4_ = fVar170 * (float)local_4b8._0_4_;
    auVar41._8_4_ = fVar188 * fStack_4b0;
    auVar41._12_4_ = fVar190 * fStack_4ac;
    auVar41._16_4_ = fVar104 * fStack_4a8;
    auVar41._20_4_ = fVar105 * fStack_4a4;
    auVar41._24_4_ = fVar106 * fStack_4a0;
    auVar41._28_4_ = auVar17._28_4_;
    auVar22 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = local_f8._4_4_ * fVar215;
    auVar42._0_4_ = local_f8._0_4_ * fVar224;
    auVar42._8_4_ = local_f8._8_4_ * fVar237;
    auVar42._12_4_ = local_f8._12_4_ * fVar218;
    auVar42._16_4_ = local_f8._16_4_ * fVar238;
    auVar42._20_4_ = local_f8._20_4_ * fVar221;
    auVar42._24_4_ = local_f8._24_4_ * fVar239;
    auVar42._28_4_ = auVar17._28_4_;
    auVar43._4_4_ = local_318._4_4_ * fVar186;
    auVar43._0_4_ = local_318._0_4_ * fVar170;
    auVar43._8_4_ = local_318._8_4_ * fVar188;
    auVar43._12_4_ = local_318._12_4_ * fVar190;
    auVar43._16_4_ = local_318._16_4_ * fVar104;
    auVar43._20_4_ = local_318._20_4_ * fVar105;
    uVar4 = local_318._28_4_;
    auVar43._24_4_ = local_318._24_4_ * fVar106;
    auVar43._28_4_ = uVar4;
    auVar23 = vsubps_avx(auVar42,auVar43);
    auVar44._4_4_ = auVar293._4_4_ * fVar215;
    auVar44._0_4_ = auVar293._0_4_ * fVar224;
    auVar44._8_4_ = auVar293._8_4_ * fVar237;
    auVar44._12_4_ = auVar293._12_4_ * fVar218;
    auVar44._16_4_ = auVar293._16_4_ * fVar238;
    auVar44._20_4_ = auVar293._20_4_ * fVar221;
    auVar44._24_4_ = auVar293._24_4_ * fVar239;
    auVar44._28_4_ = uVar4;
    auVar45._4_4_ = auVar264._4_4_ * fVar186;
    auVar45._0_4_ = auVar264._0_4_ * fVar170;
    auVar45._8_4_ = auVar264._8_4_ * fVar188;
    auVar45._12_4_ = auVar264._12_4_ * fVar190;
    auVar45._16_4_ = auVar264._16_4_ * fVar104;
    auVar45._20_4_ = auVar264._20_4_ * fVar105;
    auVar45._24_4_ = auVar264._24_4_ * fVar106;
    auVar45._28_4_ = auVar264._28_4_;
    auVar24 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = fVar215 * fStack_174;
    auVar46._0_4_ = fVar224 * local_178;
    auVar46._8_4_ = fVar237 * fStack_170;
    auVar46._12_4_ = fVar218 * fStack_16c;
    auVar46._16_4_ = fVar238 * fStack_168;
    auVar46._20_4_ = fVar221 * fStack_164;
    auVar46._24_4_ = fVar239 * fStack_160;
    auVar46._28_4_ = uVar4;
    auVar47._4_4_ = fVar186 * fStack_154;
    auVar47._0_4_ = fVar170 * local_158;
    auVar47._8_4_ = fVar188 * fStack_150;
    auVar47._12_4_ = fVar190 * fStack_14c;
    auVar47._16_4_ = fVar104 * fStack_148;
    auVar47._20_4_ = fVar105 * fStack_144;
    auVar47._24_4_ = fVar106 * fStack_140;
    auVar47._28_4_ = auVar293._28_4_;
    auVar25 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = fVar215 * local_b8._4_4_;
    auVar48._0_4_ = fVar224 * local_b8._0_4_;
    auVar48._8_4_ = fVar237 * local_b8._8_4_;
    auVar48._12_4_ = fVar218 * local_b8._12_4_;
    auVar48._16_4_ = fVar238 * local_b8._16_4_;
    auVar48._20_4_ = fVar221 * local_b8._20_4_;
    auVar48._24_4_ = fVar239 * local_b8._24_4_;
    auVar48._28_4_ = auVar293._28_4_;
    auVar49._4_4_ = (float)local_3e8._4_4_ * fVar186;
    auVar49._0_4_ = (float)local_3e8._0_4_ * fVar170;
    auVar49._8_4_ = fStack_3e0 * fVar188;
    auVar49._12_4_ = fStack_3dc * fVar190;
    auVar49._16_4_ = fStack_3d8 * fVar104;
    auVar49._20_4_ = fStack_3d4 * fVar105;
    auVar49._24_4_ = fStack_3d0 * fVar106;
    auVar49._28_4_ = local_f8._28_4_;
    auVar26 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = fVar215 * local_468._4_4_;
    auVar50._0_4_ = fVar224 * local_468._0_4_;
    auVar50._8_4_ = fVar237 * local_468._8_4_;
    auVar50._12_4_ = fVar218 * local_468._12_4_;
    auVar50._16_4_ = fVar238 * local_468._16_4_;
    auVar50._20_4_ = fVar221 * local_468._20_4_;
    auVar50._24_4_ = fVar239 * local_468._24_4_;
    auVar50._28_4_ = auVar18._28_4_ + auVar16._28_4_;
    auVar51._4_4_ = auVar99._4_4_ * fVar186;
    auVar51._0_4_ = auVar99._0_4_ * fVar170;
    auVar51._8_4_ = auVar99._8_4_ * fVar188;
    auVar51._12_4_ = auVar99._12_4_ * fVar190;
    auVar51._16_4_ = auVar99._16_4_ * fVar104;
    auVar51._20_4_ = auVar99._20_4_ * fVar105;
    auVar51._24_4_ = auVar99._24_4_ * fVar106;
    auVar51._28_4_ = auVar19._28_4_ + fVar193;
    auVar27 = vsubps_avx(auVar50,auVar51);
    auVar16 = vminps_avx(auVar20,auVar21);
    auVar18 = vmaxps_avx(auVar20,auVar21);
    auVar17 = vminps_avx(auVar22,auVar23);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar22,auVar23);
    auVar18 = vmaxps_avx(auVar18,auVar16);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar16 = vmaxps_avx(auVar24,auVar25);
    auVar99 = vminps_avx(auVar26,auVar27);
    auVar19 = vminps_avx(auVar19,auVar99);
    auVar19 = vminps_avx(auVar17,auVar19);
    auVar17 = vmaxps_avx(auVar26,auVar27);
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar18,auVar16);
    auVar18 = vcmpps_avx(auVar19,local_78,2);
    auVar16 = vcmpps_avx(auVar16,local_98,5);
    auVar18 = vandps_avx(auVar16,auVar18);
    auVar135 = vandps_avx(local_198,auVar135);
    auVar16 = auVar135 & auVar18;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar135 = vandps_avx(auVar18,auVar135);
      uVar59 = vmovmskps_avx(auVar135);
      if (uVar59 != 0) {
        auStack_2a8[uVar60] = uVar59 & 0xff;
        uVar5 = vmovlps_avx(local_218);
        *(undefined8 *)(afStack_1b8 + uVar60 * 2) = uVar5;
        uVar6 = vmovlps_avx(auVar319);
        auStack_58[uVar60] = uVar6;
        uVar60 = (ulong)((int)uVar60 + 1);
      }
    }
  }
LAB_00946d56:
  do {
    do {
      do {
        do {
          if ((int)uVar60 == 0) {
            auVar53 = ZEXT812(0) << 0x20;
            if (bVar67) goto LAB_00947cb9;
            fVar193 = ray->tfar;
            auVar98._4_4_ = fVar193;
            auVar98._0_4_ = fVar193;
            auVar98._8_4_ = fVar193;
            auVar98._12_4_ = fVar193;
            auVar87 = vcmpps_avx(local_228,auVar98,2);
            uVar59 = vmovmskps_avx(auVar87);
            uVar64 = uVar64 & uVar64 + 0xf & uVar59;
            goto LAB_00945aee;
          }
          uVar61 = (int)uVar60 - 1;
          uVar62 = (ulong)uVar61;
          uVar59 = auStack_2a8[uVar62];
          fVar193 = afStack_1b8[uVar62 * 2];
          fVar224 = afStack_1b8[uVar62 * 2 + 1];
          auVar320._8_8_ = 0;
          auVar320._0_8_ = auStack_58[uVar62];
          auVar322 = ZEXT1664(auVar320);
          uVar6 = 0;
          if (uVar59 != 0) {
            for (; (uVar59 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar59 = uVar59 - 1 & uVar59;
          auStack_2a8[uVar62] = uVar59;
          if (uVar59 == 0) {
            uVar60 = (ulong)uVar61;
          }
          auVar253 = ZEXT1664(local_438);
          auVar332 = ZEXT1664(local_448);
          auVar265 = ZEXT1664(local_328);
          auVar283 = ZEXT1664(local_338);
          auVar294 = ZEXT1664(local_348);
          auVar308 = ZEXT1664(local_358);
          auVar315 = ZEXT1664(local_368);
          fVar237 = (float)(uVar6 + 1) * 0.14285715;
          fVar215 = (1.0 - (float)uVar6 * 0.14285715) * fVar193 +
                    fVar224 * (float)uVar6 * 0.14285715;
          fVar193 = (1.0 - fVar237) * fVar193 + fVar224 * fVar237;
          fVar224 = fVar193 - fVar215;
          if (0.16666667 <= fVar224) {
            auVar87 = vinsertps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar193),0x10);
            auVar344 = ZEXT1664(auVar87);
            goto LAB_009466f0;
          }
          auVar87 = vshufps_avx(auVar320,auVar320,0x50);
          auVar116._8_4_ = 0x3f800000;
          auVar116._0_8_ = 0x3f8000003f800000;
          auVar116._12_4_ = 0x3f800000;
          auVar300 = vsubps_avx(auVar116,auVar87);
          fVar237 = auVar87._0_4_;
          fVar218 = auVar87._4_4_;
          fVar238 = auVar87._8_4_;
          fVar221 = auVar87._12_4_;
          fVar239 = auVar300._0_4_;
          fVar170 = auVar300._4_4_;
          fVar186 = auVar300._8_4_;
          fVar188 = auVar300._12_4_;
          auVar150._0_4_ = fVar237 * auVar277._0_4_ + fVar239 * local_438._0_4_;
          auVar150._4_4_ = fVar218 * auVar277._4_4_ + fVar170 * local_438._4_4_;
          auVar150._8_4_ = fVar238 * auVar277._0_4_ + fVar186 * local_438._8_4_;
          auVar150._12_4_ = fVar221 * auVar277._4_4_ + fVar188 * local_438._12_4_;
          auVar204._0_4_ = local_348._0_4_ * fVar237 + local_448._0_4_ * fVar239;
          auVar204._4_4_ = local_348._4_4_ * fVar218 + local_448._4_4_ * fVar170;
          auVar204._8_4_ = local_348._8_4_ * fVar238 + local_448._8_4_ * fVar186;
          auVar204._12_4_ = local_348._12_4_ * fVar221 + local_448._12_4_ * fVar188;
          auVar229._0_4_ = local_358._0_4_ * fVar237 + fVar239 * local_328._0_4_;
          auVar229._4_4_ = local_358._4_4_ * fVar218 + fVar170 * local_328._4_4_;
          auVar229._8_4_ = local_358._8_4_ * fVar238 + fVar186 * local_328._8_4_;
          auVar229._12_4_ = local_358._12_4_ * fVar221 + fVar188 * local_328._12_4_;
          auVar84._0_4_ = local_368._0_4_ * fVar237 + local_338._0_4_ * fVar239;
          auVar84._4_4_ = local_368._4_4_ * fVar218 + local_338._4_4_ * fVar170;
          auVar84._8_4_ = local_368._8_4_ * fVar238 + local_338._8_4_ * fVar186;
          auVar84._12_4_ = local_368._12_4_ * fVar221 + local_338._12_4_ * fVar188;
          auVar137._16_16_ = auVar150;
          auVar137._0_16_ = auVar150;
          auVar168._16_16_ = auVar204;
          auVar168._0_16_ = auVar204;
          auVar214._16_16_ = auVar229;
          auVar214._0_16_ = auVar229;
          _local_488 = ZEXT416((uint)fVar193);
          auVar135 = ZEXT2032(CONCAT416(fVar193,ZEXT416((uint)fVar215)));
          auVar135 = vshufps_avx(auVar135,auVar135,0);
          auVar18 = vsubps_avx(auVar168,auVar137);
          fVar237 = auVar135._0_4_;
          fVar218 = auVar135._4_4_;
          fVar238 = auVar135._8_4_;
          fVar221 = auVar135._12_4_;
          fVar239 = auVar135._16_4_;
          fVar170 = auVar135._20_4_;
          fVar186 = auVar135._24_4_;
          auVar138._0_4_ = auVar150._0_4_ + auVar18._0_4_ * fVar237;
          auVar138._4_4_ = auVar150._4_4_ + auVar18._4_4_ * fVar218;
          auVar138._8_4_ = auVar150._8_4_ + auVar18._8_4_ * fVar238;
          auVar138._12_4_ = auVar150._12_4_ + auVar18._12_4_ * fVar221;
          auVar138._16_4_ = auVar150._0_4_ + auVar18._16_4_ * fVar239;
          auVar138._20_4_ = auVar150._4_4_ + auVar18._20_4_ * fVar170;
          auVar138._24_4_ = auVar150._8_4_ + auVar18._24_4_ * fVar186;
          auVar138._28_4_ = auVar150._12_4_ + auVar18._28_4_;
          auVar135 = vsubps_avx(auVar214,auVar168);
          auVar169._0_4_ = auVar204._0_4_ + auVar135._0_4_ * fVar237;
          auVar169._4_4_ = auVar204._4_4_ + auVar135._4_4_ * fVar218;
          auVar169._8_4_ = auVar204._8_4_ + auVar135._8_4_ * fVar238;
          auVar169._12_4_ = auVar204._12_4_ + auVar135._12_4_ * fVar221;
          auVar169._16_4_ = auVar204._0_4_ + auVar135._16_4_ * fVar239;
          auVar169._20_4_ = auVar204._4_4_ + auVar135._20_4_ * fVar170;
          auVar169._24_4_ = auVar204._8_4_ + auVar135._24_4_ * fVar186;
          auVar169._28_4_ = auVar204._12_4_ + auVar135._28_4_;
          auVar87 = vsubps_avx(auVar84,auVar229);
          auVar102._0_4_ = auVar229._0_4_ + auVar87._0_4_ * fVar237;
          auVar102._4_4_ = auVar229._4_4_ + auVar87._4_4_ * fVar218;
          auVar102._8_4_ = auVar229._8_4_ + auVar87._8_4_ * fVar238;
          auVar102._12_4_ = auVar229._12_4_ + auVar87._12_4_ * fVar221;
          auVar102._16_4_ = auVar229._0_4_ + auVar87._0_4_ * fVar239;
          auVar102._20_4_ = auVar229._4_4_ + auVar87._4_4_ * fVar170;
          auVar102._24_4_ = auVar229._8_4_ + auVar87._8_4_ * fVar186;
          auVar102._28_4_ = auVar229._12_4_ + auVar87._12_4_;
          auVar135 = vsubps_avx(auVar169,auVar138);
          auVar139._0_4_ = auVar138._0_4_ + fVar237 * auVar135._0_4_;
          auVar139._4_4_ = auVar138._4_4_ + fVar218 * auVar135._4_4_;
          auVar139._8_4_ = auVar138._8_4_ + fVar238 * auVar135._8_4_;
          auVar139._12_4_ = auVar138._12_4_ + fVar221 * auVar135._12_4_;
          auVar139._16_4_ = auVar138._16_4_ + fVar239 * auVar135._16_4_;
          auVar139._20_4_ = auVar138._20_4_ + fVar170 * auVar135._20_4_;
          auVar139._24_4_ = auVar138._24_4_ + fVar186 * auVar135._24_4_;
          auVar139._28_4_ = auVar138._28_4_ + auVar135._28_4_;
          auVar135 = vsubps_avx(auVar102,auVar169);
          auVar103._0_4_ = auVar169._0_4_ + fVar237 * auVar135._0_4_;
          auVar103._4_4_ = auVar169._4_4_ + fVar218 * auVar135._4_4_;
          auVar103._8_4_ = auVar169._8_4_ + fVar238 * auVar135._8_4_;
          auVar103._12_4_ = auVar169._12_4_ + fVar221 * auVar135._12_4_;
          auVar103._16_4_ = auVar169._16_4_ + fVar239 * auVar135._16_4_;
          auVar103._20_4_ = auVar169._20_4_ + fVar170 * auVar135._20_4_;
          auVar103._24_4_ = auVar169._24_4_ + fVar186 * auVar135._24_4_;
          auVar103._28_4_ = auVar169._28_4_ + auVar135._28_4_;
          auVar135 = vsubps_avx(auVar103,auVar139);
          auVar249._0_4_ = auVar139._0_4_ + fVar237 * auVar135._0_4_;
          auVar249._4_4_ = auVar139._4_4_ + fVar218 * auVar135._4_4_;
          auVar249._8_4_ = auVar139._8_4_ + fVar238 * auVar135._8_4_;
          auVar249._12_4_ = auVar139._12_4_ + fVar221 * auVar135._12_4_;
          auVar252._16_4_ = auVar139._16_4_ + fVar239 * auVar135._16_4_;
          auVar252._0_16_ = auVar249;
          auVar252._20_4_ = auVar139._20_4_ + fVar170 * auVar135._20_4_;
          auVar252._24_4_ = auVar139._24_4_ + fVar186 * auVar135._24_4_;
          auVar252._28_4_ = auVar139._28_4_ + auVar169._28_4_;
          auVar255 = auVar252._16_16_;
          auVar118 = vshufps_avx(ZEXT416((uint)(fVar224 * 0.33333334)),
                                 ZEXT416((uint)(fVar224 * 0.33333334)),0);
          auVar205._0_4_ = auVar249._0_4_ + auVar118._0_4_ * auVar135._0_4_ * 3.0;
          auVar205._4_4_ = auVar249._4_4_ + auVar118._4_4_ * auVar135._4_4_ * 3.0;
          auVar205._8_4_ = auVar249._8_4_ + auVar118._8_4_ * auVar135._8_4_ * 3.0;
          auVar205._12_4_ = auVar249._12_4_ + auVar118._12_4_ * auVar135._12_4_ * 3.0;
          auVar166 = vshufpd_avx(auVar249,auVar249,3);
          auVar130 = vshufpd_avx(auVar255,auVar255,3);
          _local_318 = auVar166;
          auVar87 = vsubps_avx(auVar166,auVar249);
          _local_468 = auVar130;
          auVar300 = vsubps_avx(auVar130,auVar255);
          auVar85._0_4_ = auVar87._0_4_ + auVar300._0_4_;
          auVar85._4_4_ = auVar87._4_4_ + auVar300._4_4_;
          auVar85._8_4_ = auVar87._8_4_ + auVar300._8_4_;
          auVar85._12_4_ = auVar87._12_4_ + auVar300._12_4_;
          auVar87 = vmovshdup_avx(auVar249);
          auVar300 = vmovshdup_avx(auVar205);
          auVar152 = vshufps_avx(auVar85,auVar85,0);
          auVar119 = vshufps_avx(auVar85,auVar85,0x55);
          fVar237 = auVar119._0_4_;
          fVar218 = auVar119._4_4_;
          fVar238 = auVar119._8_4_;
          fVar221 = auVar119._12_4_;
          fVar239 = auVar152._0_4_;
          fVar170 = auVar152._4_4_;
          fVar186 = auVar152._8_4_;
          fVar188 = auVar152._12_4_;
          auVar86._0_4_ = fVar239 * auVar249._0_4_ + auVar87._0_4_ * fVar237;
          auVar86._4_4_ = fVar170 * auVar249._4_4_ + auVar87._4_4_ * fVar218;
          auVar86._8_4_ = fVar186 * auVar249._8_4_ + auVar87._8_4_ * fVar238;
          auVar86._12_4_ = fVar188 * auVar249._12_4_ + auVar87._12_4_ * fVar221;
          _local_3e8 = auVar205;
          auVar311._0_4_ = fVar239 * auVar205._0_4_ + auVar300._0_4_ * fVar237;
          auVar311._4_4_ = fVar170 * auVar205._4_4_ + auVar300._4_4_ * fVar218;
          auVar311._8_4_ = fVar186 * auVar205._8_4_ + auVar300._8_4_ * fVar238;
          auVar311._12_4_ = fVar188 * auVar205._12_4_ + auVar300._12_4_ * fVar221;
          auVar300 = vshufps_avx(auVar86,auVar86,0xe8);
          auVar152 = vshufps_avx(auVar311,auVar311,0xe8);
          auVar87 = vcmpps_avx(auVar300,auVar152,1);
          uVar59 = vextractps_avx(auVar87,0);
          auVar119 = auVar311;
          if ((uVar59 & 1) == 0) {
            auVar119 = auVar86;
          }
          auVar117._0_4_ = auVar118._0_4_ * auVar135._16_4_ * 3.0;
          auVar117._4_4_ = auVar118._4_4_ * auVar135._20_4_ * 3.0;
          auVar117._8_4_ = auVar118._8_4_ * auVar135._24_4_ * 3.0;
          auVar117._12_4_ = auVar118._12_4_ * 0.0;
          auVar15 = vsubps_avx(auVar255,auVar117);
          auVar118 = vmovshdup_avx(auVar15);
          auVar255 = vmovshdup_avx(auVar255);
          fVar190 = auVar15._0_4_;
          fVar104 = auVar15._4_4_;
          auVar230._0_4_ = fVar190 * fVar239 + auVar118._0_4_ * fVar237;
          auVar230._4_4_ = fVar104 * fVar170 + auVar118._4_4_ * fVar218;
          auVar230._8_4_ = auVar15._8_4_ * fVar186 + auVar118._8_4_ * fVar238;
          auVar230._12_4_ = auVar15._12_4_ * fVar188 + auVar118._12_4_ * fVar221;
          auVar343._0_4_ = fVar239 * auVar252._16_4_ + auVar255._0_4_ * fVar237;
          auVar343._4_4_ = fVar170 * auVar252._20_4_ + auVar255._4_4_ * fVar218;
          auVar343._8_4_ = fVar186 * auVar252._24_4_ + auVar255._8_4_ * fVar238;
          auVar343._12_4_ = fVar188 * auVar252._28_4_ + auVar255._12_4_ * fVar221;
          auVar255 = vshufps_avx(auVar230,auVar230,0xe8);
          auVar273 = vshufps_avx(auVar343,auVar343,0xe8);
          auVar118 = vcmpps_avx(auVar255,auVar273,1);
          uVar59 = vextractps_avx(auVar118,0);
          auVar319 = auVar343;
          if ((uVar59 & 1) == 0) {
            auVar319 = auVar230;
          }
          auVar119 = vmaxss_avx(auVar319,auVar119);
          auVar300 = vminps_avx(auVar300,auVar152);
          auVar152 = vminps_avx(auVar255,auVar273);
          auVar152 = vminps_avx(auVar300,auVar152);
          auVar87 = vshufps_avx(auVar87,auVar87,0x55);
          auVar87 = vblendps_avx(auVar87,auVar118,2);
          auVar118 = vpslld_avx(auVar87,0x1f);
          auVar87 = vshufpd_avx(auVar311,auVar311,1);
          auVar87 = vinsertps_avx(auVar87,auVar343,0x9c);
          auVar300 = vshufpd_avx(auVar86,auVar86,1);
          auVar300 = vinsertps_avx(auVar300,auVar230,0x9c);
          auVar87 = vblendvps_avx(auVar300,auVar87,auVar118);
          auVar300 = vmovshdup_avx(auVar87);
          auVar87 = vmaxss_avx(auVar300,auVar87);
          fVar238 = auVar152._0_4_;
          auVar300 = vmovshdup_avx(auVar152);
          fVar218 = auVar87._0_4_;
          fVar221 = auVar300._0_4_;
          fVar237 = auVar119._0_4_;
          if ((fVar238 < 0.0001) && (-0.0001 < fVar218)) break;
          if ((fVar221 < 0.0001 && -0.0001 < fVar237) || (fVar238 < 0.0001 && -0.0001 < fVar237))
          break;
          auVar118 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar87,1);
          auVar300 = vcmpps_avx(auVar300,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar300 = vandps_avx(auVar300,auVar118);
        } while ((auVar300 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar118 = vcmpps_avx(auVar152,_DAT_01f45a50,1);
        auVar300 = vcmpss_avx(auVar119,ZEXT416(0) << 0x20,1);
        auVar151._8_4_ = 0x3f800000;
        auVar151._0_8_ = 0x3f8000003f800000;
        auVar151._12_4_ = 0x3f800000;
        auVar206._8_4_ = 0xbf800000;
        auVar206._0_8_ = 0xbf800000bf800000;
        auVar206._12_4_ = 0xbf800000;
        auVar300 = vblendvps_avx(auVar151,auVar206,auVar300);
        auVar118 = vblendvps_avx(auVar151,auVar206,auVar118);
        auVar152 = vcmpss_avx(auVar118,auVar300,4);
        auVar152 = vpshufd_avx(ZEXT416(auVar152._0_4_ & 1),0x50);
        auVar152 = vpslld_avx(auVar152,0x1f);
        auVar152 = vpsrad_avx(auVar152,0x1f);
        auVar152 = vpandn_avx(auVar152,_DAT_01f7afb0);
        auVar119 = vmovshdup_avx(auVar118);
        fVar239 = auVar119._0_4_;
        if ((auVar118._0_4_ != fVar239) || (NAN(auVar118._0_4_) || NAN(fVar239))) {
          if ((fVar221 != fVar238) || (NAN(fVar221) || NAN(fVar238))) {
            fVar238 = -fVar238 / (fVar221 - fVar238);
            auVar118 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar238) * 0.0 + fVar238)));
          }
          else {
            auVar118 = ZEXT816(0x3f80000000000000);
            if ((fVar238 != 0.0) || (NAN(fVar238))) {
              auVar118 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar255 = vcmpps_avx(auVar152,auVar118,1);
          auVar119 = vblendps_avx(auVar152,auVar118,2);
          auVar118 = vblendps_avx(auVar118,auVar152,2);
          auVar152 = vblendvps_avx(auVar118,auVar119,auVar255);
        }
        auVar87 = vcmpss_avx(auVar87,ZEXT416(0) << 0x20,1);
        auVar153._8_4_ = 0x3f800000;
        auVar153._0_8_ = 0x3f8000003f800000;
        auVar153._12_4_ = 0x3f800000;
        auVar207._8_4_ = 0xbf800000;
        auVar207._0_8_ = 0xbf800000bf800000;
        auVar207._12_4_ = 0xbf800000;
        auVar87 = vblendvps_avx(auVar153,auVar207,auVar87);
        fVar238 = auVar87._0_4_;
        if ((auVar300._0_4_ != fVar238) || (NAN(auVar300._0_4_) || NAN(fVar238))) {
          if ((fVar218 != fVar237) || (NAN(fVar218) || NAN(fVar237))) {
            fVar237 = -fVar237 / (fVar218 - fVar237);
            auVar87 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar237) * 0.0 + fVar237)));
          }
          else {
            auVar87 = ZEXT816(0x3f80000000000000);
            if ((fVar237 != 0.0) || (NAN(fVar237))) {
              auVar87 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar118 = vcmpps_avx(auVar152,auVar87,1);
          auVar300 = vblendps_avx(auVar152,auVar87,2);
          auVar87 = vblendps_avx(auVar87,auVar152,2);
          auVar152 = vblendvps_avx(auVar87,auVar300,auVar118);
        }
        if ((fVar239 != fVar238) || (NAN(fVar239) || NAN(fVar238))) {
          auVar88._8_4_ = 0x3f800000;
          auVar88._0_8_ = 0x3f8000003f800000;
          auVar88._12_4_ = 0x3f800000;
          auVar87 = vcmpps_avx(auVar152,auVar88,1);
          auVar300 = vinsertps_avx(auVar152,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar154._4_12_ = auVar152._4_12_;
          auVar154._0_4_ = 0x3f800000;
          auVar152 = vblendvps_avx(auVar154,auVar300,auVar87);
        }
        auVar87 = vcmpps_avx(auVar152,_DAT_01f46740,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar152._4_12_;
        auVar300 = vinsertps_avx(auVar152,ZEXT416(0x3f800000),0x10);
        auVar87 = vblendvps_avx(auVar300,auVar54 << 0x20,auVar87);
        auVar300 = vmovshdup_avx(auVar87);
      } while (auVar300._0_4_ < auVar87._0_4_);
      auVar89._0_4_ = auVar87._0_4_ + -0.1;
      auVar89._4_4_ = auVar87._4_4_ + 0.1;
      auVar89._8_4_ = auVar87._8_4_ + 0.0;
      auVar89._12_4_ = auVar87._12_4_ + 0.0;
      auVar118 = vshufpd_avx(auVar205,auVar205,3);
      register0x00001388 = 0x3f80000000000000;
      local_3e8 = 0x3f80000000000000;
      auVar87 = vcmpps_avx(auVar89,_local_3e8,1);
      auVar52._12_4_ = 0;
      auVar52._0_12_ = auVar89._4_12_;
      auVar300 = vinsertps_avx(auVar89,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar87 = vblendvps_avx(auVar300,auVar52 << 0x20,auVar87);
      auVar300 = vshufpd_avx(auVar15,auVar15,3);
      auVar152 = vshufps_avx(auVar87,auVar87,0x50);
      auVar250._8_4_ = 0x3f800000;
      auVar250._0_8_ = 0x3f8000003f800000;
      auVar250._12_4_ = 0x3f800000;
      auVar119 = vsubps_avx(auVar250,auVar152);
      local_318._0_4_ = auVar166._0_4_;
      local_318._4_4_ = auVar166._4_4_;
      fStack_310 = auVar166._8_4_;
      fStack_30c = auVar166._12_4_;
      fVar237 = auVar152._0_4_;
      fVar218 = auVar152._4_4_;
      fVar238 = auVar152._8_4_;
      fVar221 = auVar152._12_4_;
      local_468._0_4_ = auVar130._0_4_;
      local_468._4_4_ = auVar130._4_4_;
      fStack_460 = auVar130._8_4_;
      fStack_45c = auVar130._12_4_;
      fVar239 = auVar119._0_4_;
      fVar170 = auVar119._4_4_;
      fVar186 = auVar119._8_4_;
      fVar188 = auVar119._12_4_;
      auVar90._0_4_ = fVar237 * (float)local_318._0_4_ + fVar239 * auVar249._0_4_;
      auVar90._4_4_ = fVar218 * (float)local_318._4_4_ + fVar170 * auVar249._4_4_;
      auVar90._8_4_ = fVar238 * fStack_310 + fVar186 * auVar249._0_4_;
      auVar90._12_4_ = fVar221 * fStack_30c + fVar188 * auVar249._4_4_;
      auVar231._0_4_ = auVar118._0_4_ * fVar237 + fVar239 * auVar205._0_4_;
      auVar231._4_4_ = auVar118._4_4_ * fVar218 + fVar170 * auVar205._4_4_;
      auVar231._8_4_ = auVar118._8_4_ * fVar238 + fVar186 * auVar205._0_4_;
      auVar231._12_4_ = auVar118._12_4_ * fVar221 + fVar188 * auVar205._4_4_;
      auVar262._0_4_ = auVar300._0_4_ * fVar237 + fVar239 * fVar190;
      auVar262._4_4_ = auVar300._4_4_ * fVar218 + fVar170 * fVar104;
      auVar262._8_4_ = auVar300._8_4_ * fVar238 + fVar186 * fVar190;
      auVar262._12_4_ = auVar300._12_4_ * fVar221 + fVar188 * fVar104;
      auVar303._0_4_ = fVar237 * (float)local_468._0_4_ + fVar239 * auVar252._16_4_;
      auVar303._4_4_ = fVar218 * (float)local_468._4_4_ + fVar170 * auVar252._20_4_;
      auVar303._8_4_ = fVar238 * fStack_460 + fVar186 * auVar252._16_4_;
      auVar303._12_4_ = fVar221 * fStack_45c + fVar188 * auVar252._20_4_;
      auVar130 = vsubps_avx(auVar250,auVar87);
      auVar300 = vmovshdup_avx(auVar320);
      auVar166 = vmovsldup_avx(auVar320);
      auVar251._0_4_ = auVar130._0_4_ * auVar166._0_4_ + auVar87._0_4_ * auVar300._0_4_;
      auVar251._4_4_ = auVar130._4_4_ * auVar166._4_4_ + auVar87._4_4_ * auVar300._4_4_;
      auVar251._8_4_ = auVar130._8_4_ * auVar166._8_4_ + auVar87._8_4_ * auVar300._8_4_;
      auVar251._12_4_ = auVar130._12_4_ * auVar166._12_4_ + auVar87._12_4_ * auVar300._12_4_;
      _local_468 = vmovshdup_avx(auVar251);
      auVar87 = vsubps_avx(auVar231,auVar90);
      auVar155._0_4_ = auVar87._0_4_ * 3.0;
      auVar155._4_4_ = auVar87._4_4_ * 3.0;
      auVar155._8_4_ = auVar87._8_4_ * 3.0;
      auVar155._12_4_ = auVar87._12_4_ * 3.0;
      auVar87 = vsubps_avx(auVar262,auVar231);
      auVar182._0_4_ = auVar87._0_4_ * 3.0;
      auVar182._4_4_ = auVar87._4_4_ * 3.0;
      auVar182._8_4_ = auVar87._8_4_ * 3.0;
      auVar182._12_4_ = auVar87._12_4_ * 3.0;
      auVar87 = vsubps_avx(auVar303,auVar262);
      auVar278._0_4_ = auVar87._0_4_ * 3.0;
      auVar278._4_4_ = auVar87._4_4_ * 3.0;
      auVar278._8_4_ = auVar87._8_4_ * 3.0;
      auVar278._12_4_ = auVar87._12_4_ * 3.0;
      auVar300 = vminps_avx(auVar182,auVar278);
      auVar87 = vmaxps_avx(auVar182,auVar278);
      auVar300 = vminps_avx(auVar155,auVar300);
      auVar87 = vmaxps_avx(auVar155,auVar87);
      auVar166 = vshufpd_avx(auVar300,auVar300,3);
      auVar130 = vshufpd_avx(auVar87,auVar87,3);
      auVar300 = vminps_avx(auVar300,auVar166);
      auVar87 = vmaxps_avx(auVar87,auVar130);
      auVar166 = vshufps_avx(ZEXT416((uint)(1.0 / fVar224)),ZEXT416((uint)(1.0 / fVar224)),0);
      auVar279._0_4_ = auVar166._0_4_ * auVar300._0_4_;
      auVar279._4_4_ = auVar166._4_4_ * auVar300._4_4_;
      auVar279._8_4_ = auVar166._8_4_ * auVar300._8_4_;
      auVar279._12_4_ = auVar166._12_4_ * auVar300._12_4_;
      auVar290._0_4_ = auVar166._0_4_ * auVar87._0_4_;
      auVar290._4_4_ = auVar166._4_4_ * auVar87._4_4_;
      auVar290._8_4_ = auVar166._8_4_ * auVar87._8_4_;
      auVar290._12_4_ = auVar166._12_4_ * auVar87._12_4_;
      auVar119 = ZEXT416((uint)(1.0 / (local_468._0_4_ - auVar251._0_4_)));
      auVar87 = vshufpd_avx(auVar90,auVar90,3);
      auVar300 = vshufpd_avx(auVar231,auVar231,3);
      auVar166 = vshufpd_avx(auVar262,auVar262,3);
      auVar130 = vshufpd_avx(auVar303,auVar303,3);
      auVar87 = vsubps_avx(auVar87,auVar90);
      auVar118 = vsubps_avx(auVar300,auVar231);
      auVar152 = vsubps_avx(auVar166,auVar262);
      auVar130 = vsubps_avx(auVar130,auVar303);
      auVar300 = vminps_avx(auVar87,auVar118);
      auVar87 = vmaxps_avx(auVar87,auVar118);
      auVar166 = vminps_avx(auVar152,auVar130);
      auVar166 = vminps_avx(auVar300,auVar166);
      auVar300 = vmaxps_avx(auVar152,auVar130);
      auVar87 = vmaxps_avx(auVar87,auVar300);
      auVar300 = vshufps_avx(auVar119,auVar119,0);
      auVar331._0_4_ = auVar300._0_4_ * auVar166._0_4_;
      auVar331._4_4_ = auVar300._4_4_ * auVar166._4_4_;
      auVar331._8_4_ = auVar300._8_4_ * auVar166._8_4_;
      auVar331._12_4_ = auVar300._12_4_ * auVar166._12_4_;
      auVar337._0_4_ = auVar300._0_4_ * auVar87._0_4_;
      auVar337._4_4_ = auVar300._4_4_ * auVar87._4_4_;
      auVar337._8_4_ = auVar300._8_4_ * auVar87._8_4_;
      auVar337._12_4_ = auVar300._12_4_ * auVar87._12_4_;
      auVar87 = vmovsldup_avx(auVar251);
      auVar304._4_12_ = auVar87._4_12_;
      auVar304._0_4_ = fVar215;
      auVar312._4_12_ = auVar251._4_12_;
      auVar312._0_4_ = fVar193;
      auVar183._0_4_ = (fVar215 + fVar193) * 0.5;
      auVar183._4_4_ = (auVar87._4_4_ + auVar251._4_4_) * 0.5;
      auVar183._8_4_ = (auVar87._8_4_ + auVar251._8_4_) * 0.5;
      auVar183._12_4_ = (auVar87._12_4_ + auVar251._12_4_) * 0.5;
      auVar87 = vshufps_avx(auVar183,auVar183,0);
      fVar237 = auVar87._0_4_;
      fVar218 = auVar87._4_4_;
      fVar238 = auVar87._8_4_;
      fVar221 = auVar87._12_4_;
      local_4c8._0_4_ = auVar274._0_4_;
      local_4c8._4_4_ = auVar274._4_4_;
      fStack_4c0 = auVar274._8_4_;
      fStack_4bc = auVar274._12_4_;
      auVar120._0_4_ = fVar237 * (float)local_1c8._0_4_ + (float)local_4c8._0_4_;
      auVar120._4_4_ = fVar218 * (float)local_1c8._4_4_ + (float)local_4c8._4_4_;
      auVar120._8_4_ = fVar238 * fStack_1c0 + fStack_4c0;
      auVar120._12_4_ = fVar221 * fStack_1bc + fStack_4bc;
      auVar156._0_4_ = fVar237 * (float)local_1d8._0_4_ + (float)local_418._0_4_;
      auVar156._4_4_ = fVar218 * (float)local_1d8._4_4_ + (float)local_418._4_4_;
      auVar156._8_4_ = fVar238 * fStack_1d0 + fStack_410;
      auVar156._12_4_ = fVar221 * fStack_1cc + fStack_40c;
      auVar232._0_4_ = fVar237 * (float)local_1e8._0_4_ + (float)local_428._0_4_;
      auVar232._4_4_ = fVar218 * (float)local_1e8._4_4_ + (float)local_428._4_4_;
      auVar232._8_4_ = fVar238 * fStack_1e0 + fStack_420;
      auVar232._12_4_ = fVar221 * fStack_1dc + fStack_41c;
      auVar87 = vsubps_avx(auVar156,auVar120);
      auVar121._0_4_ = auVar120._0_4_ + fVar237 * auVar87._0_4_;
      auVar121._4_4_ = auVar120._4_4_ + fVar218 * auVar87._4_4_;
      auVar121._8_4_ = auVar120._8_4_ + fVar238 * auVar87._8_4_;
      auVar121._12_4_ = auVar120._12_4_ + fVar221 * auVar87._12_4_;
      auVar87 = vsubps_avx(auVar232,auVar156);
      auVar157._0_4_ = auVar156._0_4_ + fVar237 * auVar87._0_4_;
      auVar157._4_4_ = auVar156._4_4_ + fVar218 * auVar87._4_4_;
      auVar157._8_4_ = auVar156._8_4_ + fVar238 * auVar87._8_4_;
      auVar157._12_4_ = auVar156._12_4_ + fVar221 * auVar87._12_4_;
      auVar87 = vsubps_avx(auVar157,auVar121);
      fVar237 = auVar121._0_4_ + fVar237 * auVar87._0_4_;
      fVar218 = auVar121._4_4_ + fVar218 * auVar87._4_4_;
      auVar91._0_8_ = CONCAT44(fVar218,fVar237);
      auVar91._8_4_ = auVar121._8_4_ + fVar238 * auVar87._8_4_;
      auVar91._12_4_ = auVar121._12_4_ + fVar221 * auVar87._12_4_;
      fVar238 = auVar87._0_4_ * 3.0;
      fVar221 = auVar87._4_4_ * 3.0;
      auVar122._0_8_ = CONCAT44(fVar221,fVar238);
      auVar122._8_4_ = auVar87._8_4_ * 3.0;
      auVar122._12_4_ = auVar87._12_4_ * 3.0;
      auVar158._8_8_ = auVar91._0_8_;
      auVar158._0_8_ = auVar91._0_8_;
      auVar87 = vshufpd_avx(auVar91,auVar91,3);
      auVar300 = vshufps_avx(auVar183,auVar183,0x55);
      auVar152 = vsubps_avx(auVar87,auVar158);
      auVar321._0_4_ = auVar152._0_4_ * auVar300._0_4_ + fVar237;
      auVar321._4_4_ = auVar152._4_4_ * auVar300._4_4_ + fVar218;
      auVar321._8_4_ = auVar152._8_4_ * auVar300._8_4_ + fVar237;
      auVar321._12_4_ = auVar152._12_4_ * auVar300._12_4_ + fVar218;
      auVar159._8_8_ = auVar122._0_8_;
      auVar159._0_8_ = auVar122._0_8_;
      auVar87 = vshufpd_avx(auVar122,auVar122,1);
      auVar87 = vsubps_avx(auVar87,auVar159);
      auVar123._0_4_ = auVar87._0_4_ * auVar300._0_4_ + fVar238;
      auVar123._4_4_ = auVar87._4_4_ * auVar300._4_4_ + fVar221;
      auVar123._8_4_ = auVar87._8_4_ * auVar300._8_4_ + fVar238;
      auVar123._12_4_ = auVar87._12_4_ * auVar300._12_4_ + fVar221;
      auVar300 = vmovshdup_avx(auVar123);
      auVar233._0_8_ = auVar300._0_8_ ^ 0x8000000080000000;
      auVar233._8_4_ = auVar300._8_4_ ^ 0x80000000;
      auVar233._12_4_ = auVar300._12_4_ ^ 0x80000000;
      auVar166 = vmovshdup_avx(auVar152);
      auVar87 = vunpcklps_avx(auVar166,auVar233);
      auVar130 = vshufps_avx(auVar87,auVar233,4);
      auVar92._0_8_ = auVar152._0_8_ ^ 0x8000000080000000;
      auVar92._8_4_ = -auVar152._8_4_;
      auVar92._12_4_ = -auVar152._12_4_;
      auVar87 = vmovlhps_avx(auVar92,auVar123);
      auVar118 = vshufps_avx(auVar87,auVar123,8);
      auVar87 = ZEXT416((uint)(auVar123._0_4_ * auVar166._0_4_ - auVar152._0_4_ * auVar300._0_4_));
      auVar300 = vshufps_avx(auVar87,auVar87,0);
      auVar87 = vdivps_avx(auVar130,auVar300);
      auVar300 = vdivps_avx(auVar118,auVar300);
      auVar118 = vinsertps_avx(auVar279,auVar331,0x1c);
      auVar152 = vinsertps_avx(auVar290,auVar337,0x1c);
      auVar119 = vinsertps_avx(auVar331,auVar279,0x4c);
      auVar255 = vinsertps_avx(auVar337,auVar290,0x4c);
      auVar166 = vmovsldup_avx(auVar87);
      auVar160._0_4_ = auVar166._0_4_ * auVar118._0_4_;
      auVar160._4_4_ = auVar166._4_4_ * auVar118._4_4_;
      auVar160._8_4_ = auVar166._8_4_ * auVar118._8_4_;
      auVar160._12_4_ = auVar166._12_4_ * auVar118._12_4_;
      auVar124._0_4_ = auVar152._0_4_ * auVar166._0_4_;
      auVar124._4_4_ = auVar152._4_4_ * auVar166._4_4_;
      auVar124._8_4_ = auVar152._8_4_ * auVar166._8_4_;
      auVar124._12_4_ = auVar152._12_4_ * auVar166._12_4_;
      auVar130 = vminps_avx(auVar160,auVar124);
      auVar166 = vmaxps_avx(auVar124,auVar160);
      auVar273 = vmovsldup_avx(auVar300);
      auVar338._0_4_ = auVar119._0_4_ * auVar273._0_4_;
      auVar338._4_4_ = auVar119._4_4_ * auVar273._4_4_;
      auVar338._8_4_ = auVar119._8_4_ * auVar273._8_4_;
      auVar338._12_4_ = auVar119._12_4_ * auVar273._12_4_;
      auVar161._0_4_ = auVar255._0_4_ * auVar273._0_4_;
      auVar161._4_4_ = auVar255._4_4_ * auVar273._4_4_;
      auVar161._8_4_ = auVar255._8_4_ * auVar273._8_4_;
      auVar161._12_4_ = auVar255._12_4_ * auVar273._12_4_;
      auVar273 = vminps_avx(auVar338,auVar161);
      auVar208._0_4_ = auVar130._0_4_ + auVar273._0_4_;
      auVar208._4_4_ = auVar130._4_4_ + auVar273._4_4_;
      auVar208._8_4_ = auVar130._8_4_ + auVar273._8_4_;
      auVar208._12_4_ = auVar130._12_4_ + auVar273._12_4_;
      auVar130 = vmaxps_avx(auVar161,auVar338);
      auVar273 = vsubps_avx(auVar304,auVar183);
      auVar15 = vsubps_avx(auVar312,auVar183);
      auVar125._0_4_ = auVar166._0_4_ + auVar130._0_4_;
      auVar125._4_4_ = auVar166._4_4_ + auVar130._4_4_;
      auVar125._8_4_ = auVar166._8_4_ + auVar130._8_4_;
      auVar125._12_4_ = auVar166._12_4_ + auVar130._12_4_;
      auVar162._8_8_ = 0x3f800000;
      auVar162._0_8_ = 0x3f800000;
      auVar166 = vsubps_avx(auVar162,auVar125);
      auVar130 = vsubps_avx(auVar162,auVar208);
      fVar186 = auVar273._0_4_;
      auVar209._0_4_ = fVar186 * auVar166._0_4_;
      fVar188 = auVar273._4_4_;
      auVar209._4_4_ = fVar188 * auVar166._4_4_;
      fVar190 = auVar273._8_4_;
      auVar209._8_4_ = fVar190 * auVar166._8_4_;
      fVar104 = auVar273._12_4_;
      auVar209._12_4_ = fVar104 * auVar166._12_4_;
      fVar238 = auVar15._0_4_;
      auVar126._0_4_ = fVar238 * auVar166._0_4_;
      fVar221 = auVar15._4_4_;
      auVar126._4_4_ = fVar221 * auVar166._4_4_;
      fVar239 = auVar15._8_4_;
      auVar126._8_4_ = fVar239 * auVar166._8_4_;
      fVar170 = auVar15._12_4_;
      auVar126._12_4_ = fVar170 * auVar166._12_4_;
      auVar305._0_4_ = fVar186 * auVar130._0_4_;
      auVar305._4_4_ = fVar188 * auVar130._4_4_;
      auVar305._8_4_ = fVar190 * auVar130._8_4_;
      auVar305._12_4_ = fVar104 * auVar130._12_4_;
      auVar163._0_4_ = fVar238 * auVar130._0_4_;
      auVar163._4_4_ = fVar221 * auVar130._4_4_;
      auVar163._8_4_ = fVar239 * auVar130._8_4_;
      auVar163._12_4_ = fVar170 * auVar130._12_4_;
      auVar166 = vminps_avx(auVar209,auVar305);
      auVar130 = vminps_avx(auVar126,auVar163);
      auVar273 = vminps_avx(auVar166,auVar130);
      auVar166 = vmaxps_avx(auVar305,auVar209);
      auVar130 = vmaxps_avx(auVar163,auVar126);
      auVar15 = vshufps_avx(auVar183,auVar183,0x54);
      auVar130 = vmaxps_avx(auVar130,auVar166);
      auVar319 = vshufps_avx(auVar321,auVar321,0);
      auVar69 = vshufps_avx(auVar321,auVar321,0x55);
      auVar166 = vhaddps_avx(auVar273,auVar273);
      auVar130 = vhaddps_avx(auVar130,auVar130);
      auVar184._0_4_ = auVar319._0_4_ * auVar87._0_4_ + auVar69._0_4_ * auVar300._0_4_;
      auVar184._4_4_ = auVar319._4_4_ * auVar87._4_4_ + auVar69._4_4_ * auVar300._4_4_;
      auVar184._8_4_ = auVar319._8_4_ * auVar87._8_4_ + auVar69._8_4_ * auVar300._8_4_;
      auVar184._12_4_ = auVar319._12_4_ * auVar87._12_4_ + auVar69._12_4_ * auVar300._12_4_;
      auVar273 = vsubps_avx(auVar15,auVar184);
      fVar237 = auVar273._0_4_ + auVar166._0_4_;
      fVar218 = auVar273._0_4_ + auVar130._0_4_;
      auVar166 = vmaxss_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar237));
      auVar130 = vminss_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar193));
    } while (auVar130._0_4_ < auVar166._0_4_);
    auVar166 = vmovshdup_avx(auVar87);
    auVar93._0_4_ = auVar166._0_4_ * auVar118._0_4_;
    auVar93._4_4_ = auVar166._4_4_ * auVar118._4_4_;
    auVar93._8_4_ = auVar166._8_4_ * auVar118._8_4_;
    auVar93._12_4_ = auVar166._12_4_ * auVar118._12_4_;
    auVar127._0_4_ = auVar152._0_4_ * auVar166._0_4_;
    auVar127._4_4_ = auVar152._4_4_ * auVar166._4_4_;
    auVar127._8_4_ = auVar152._8_4_ * auVar166._8_4_;
    auVar127._12_4_ = auVar152._12_4_ * auVar166._12_4_;
    auVar130 = vminps_avx(auVar93,auVar127);
    auVar166 = vmaxps_avx(auVar127,auVar93);
    auVar118 = vmovshdup_avx(auVar300);
    auVar210._0_4_ = auVar119._0_4_ * auVar118._0_4_;
    auVar210._4_4_ = auVar119._4_4_ * auVar118._4_4_;
    auVar210._8_4_ = auVar119._8_4_ * auVar118._8_4_;
    auVar210._12_4_ = auVar119._12_4_ * auVar118._12_4_;
    auVar128._0_4_ = auVar255._0_4_ * auVar118._0_4_;
    auVar128._4_4_ = auVar255._4_4_ * auVar118._4_4_;
    auVar128._8_4_ = auVar255._8_4_ * auVar118._8_4_;
    auVar128._12_4_ = auVar255._12_4_ * auVar118._12_4_;
    auVar118 = vminps_avx(auVar210,auVar128);
    auVar164._0_4_ = auVar130._0_4_ + auVar118._0_4_;
    auVar164._4_4_ = auVar130._4_4_ + auVar118._4_4_;
    auVar164._8_4_ = auVar130._8_4_ + auVar118._8_4_;
    auVar164._12_4_ = auVar130._12_4_ + auVar118._12_4_;
    auVar130 = vmaxps_avx(auVar128,auVar210);
    auVar94._0_4_ = auVar166._0_4_ + auVar130._0_4_;
    auVar94._4_4_ = auVar166._4_4_ + auVar130._4_4_;
    auVar94._8_4_ = auVar166._8_4_ + auVar130._8_4_;
    auVar94._12_4_ = auVar166._12_4_ + auVar130._12_4_;
    auVar166 = vsubps_avx(_local_3e8,auVar94);
    auVar130 = vsubps_avx(_local_3e8,auVar164);
    auVar165._0_4_ = fVar186 * auVar166._0_4_;
    auVar165._4_4_ = fVar188 * auVar166._4_4_;
    auVar165._8_4_ = fVar190 * auVar166._8_4_;
    auVar165._12_4_ = fVar104 * auVar166._12_4_;
    auVar211._0_4_ = fVar186 * auVar130._0_4_;
    auVar211._4_4_ = fVar188 * auVar130._4_4_;
    auVar211._8_4_ = fVar190 * auVar130._8_4_;
    auVar211._12_4_ = fVar104 * auVar130._12_4_;
    auVar95._0_4_ = fVar238 * auVar166._0_4_;
    auVar95._4_4_ = fVar221 * auVar166._4_4_;
    auVar95._8_4_ = fVar239 * auVar166._8_4_;
    auVar95._12_4_ = fVar170 * auVar166._12_4_;
    auVar129._0_4_ = fVar238 * auVar130._0_4_;
    auVar129._4_4_ = fVar221 * auVar130._4_4_;
    auVar129._8_4_ = fVar239 * auVar130._8_4_;
    auVar129._12_4_ = fVar170 * auVar130._12_4_;
    auVar166 = vminps_avx(auVar165,auVar211);
    auVar130 = vminps_avx(auVar95,auVar129);
    auVar166 = vminps_avx(auVar166,auVar130);
    auVar130 = vmaxps_avx(auVar211,auVar165);
    auVar118 = vmaxps_avx(auVar129,auVar95);
    auVar166 = vhaddps_avx(auVar166,auVar166);
    auVar130 = vmaxps_avx(auVar118,auVar130);
    auVar130 = vhaddps_avx(auVar130,auVar130);
    auVar118 = vmovshdup_avx(auVar273);
    auVar152 = ZEXT416((uint)(auVar118._0_4_ + auVar166._0_4_));
    auVar166 = vmaxss_avx(auVar251,auVar152);
    auVar118 = ZEXT416((uint)(auVar118._0_4_ + auVar130._0_4_));
    auVar130 = vminss_avx(auVar118,_local_468);
  } while (auVar130._0_4_ < auVar166._0_4_);
  bVar63 = 0;
  if ((fVar215 < fVar237) && (fVar218 < fVar193)) {
    auVar166 = vcmpps_avx(auVar118,_local_468,1);
    auVar130 = vcmpps_avx(auVar251,auVar152,1);
    auVar166 = vandps_avx(auVar130,auVar166);
    bVar63 = auVar166[0];
  }
  auVar280._8_4_ = 0x7fffffff;
  auVar280._0_8_ = 0x7fffffff7fffffff;
  auVar280._12_4_ = 0x7fffffff;
  if (((uint)uVar60 < 4 && 0.001 <= fVar224) && (bVar63 & 1) == 0) goto LAB_00947c30;
  lVar65 = 0xc9;
  do {
    lVar65 = lVar65 + -1;
    if (lVar65 == 0) goto LAB_00946d56;
    fVar224 = auVar273._0_4_;
    fVar193 = 1.0 - fVar224;
    auVar166 = ZEXT416((uint)(fVar193 * fVar193 * fVar193));
    auVar166 = vshufps_avx(auVar166,auVar166,0);
    auVar130 = ZEXT416((uint)(fVar224 * 3.0 * fVar193 * fVar193));
    auVar130 = vshufps_avx(auVar130,auVar130,0);
    auVar118 = ZEXT416((uint)(fVar193 * fVar224 * fVar224 * 3.0));
    auVar118 = vshufps_avx(auVar118,auVar118,0);
    auVar152 = ZEXT416((uint)(fVar224 * fVar224 * fVar224));
    auVar152 = vshufps_avx(auVar152,auVar152,0);
    fVar193 = (float)local_4c8._0_4_ * auVar166._0_4_ +
              (float)local_418._0_4_ * auVar130._0_4_ +
              (float)local_1f8._0_4_ * auVar152._0_4_ + (float)local_428._0_4_ * auVar118._0_4_;
    fVar224 = (float)local_4c8._4_4_ * auVar166._4_4_ +
              (float)local_418._4_4_ * auVar130._4_4_ +
              (float)local_1f8._4_4_ * auVar152._4_4_ + (float)local_428._4_4_ * auVar118._4_4_;
    auVar96._0_8_ = CONCAT44(fVar224,fVar193);
    auVar96._8_4_ =
         fStack_4c0 * auVar166._8_4_ +
         fStack_410 * auVar130._8_4_ + fStack_1f0 * auVar152._8_4_ + fStack_420 * auVar118._8_4_;
    auVar96._12_4_ =
         fStack_4bc * auVar166._12_4_ +
         fStack_40c * auVar130._12_4_ + fStack_1ec * auVar152._12_4_ + fStack_41c * auVar118._12_4_;
    auVar131._8_8_ = auVar96._0_8_;
    auVar131._0_8_ = auVar96._0_8_;
    auVar130 = vshufpd_avx(auVar96,auVar96,1);
    auVar166 = vmovshdup_avx(auVar273);
    auVar130 = vsubps_avx(auVar130,auVar131);
    auVar97._0_4_ = auVar166._0_4_ * auVar130._0_4_ + fVar193;
    auVar97._4_4_ = auVar166._4_4_ * auVar130._4_4_ + fVar224;
    auVar97._8_4_ = auVar166._8_4_ * auVar130._8_4_ + fVar193;
    auVar97._12_4_ = auVar166._12_4_ * auVar130._12_4_ + fVar224;
    auVar166 = vshufps_avx(auVar97,auVar97,0);
    auVar130 = vshufps_avx(auVar97,auVar97,0x55);
    auVar132._0_4_ = auVar87._0_4_ * auVar166._0_4_ + auVar300._0_4_ * auVar130._0_4_;
    auVar132._4_4_ = auVar87._4_4_ * auVar166._4_4_ + auVar300._4_4_ * auVar130._4_4_;
    auVar132._8_4_ = auVar87._8_4_ * auVar166._8_4_ + auVar300._8_4_ * auVar130._8_4_;
    auVar132._12_4_ = auVar87._12_4_ * auVar166._12_4_ + auVar300._12_4_ * auVar130._12_4_;
    auVar273 = vsubps_avx(auVar273,auVar132);
    auVar166 = vandps_avx(auVar280,auVar97);
    auVar130 = vshufps_avx(auVar166,auVar166,0xf5);
    auVar166 = vmaxss_avx(auVar130,auVar166);
  } while ((float)local_208._0_4_ <= auVar166._0_4_);
  fVar193 = auVar273._0_4_;
  if ((fVar193 < 0.0) || (1.0 < fVar193)) goto LAB_00946d56;
  auVar87 = vmovshdup_avx(auVar273);
  fVar224 = auVar87._0_4_;
  if ((fVar224 < 0.0) || (1.0 < fVar224)) goto LAB_00946d56;
  auVar87 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar255 = vinsertps_avx(auVar87,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar7 = (ray->org).field_0;
  auVar87 = vsubps_avx(_local_378,(undefined1  [16])aVar7);
  auVar87 = vdpps_avx(auVar87,auVar255,0x7f);
  auVar300 = vsubps_avx(_local_388,(undefined1  [16])aVar7);
  auVar300 = vdpps_avx(auVar300,auVar255,0x7f);
  auVar166 = vsubps_avx(_local_398,(undefined1  [16])aVar7);
  auVar166 = vdpps_avx(auVar166,auVar255,0x7f);
  auVar58._4_4_ = fStack_3f4;
  auVar58._0_4_ = local_3f8;
  auVar58._8_4_ = fStack_3f0;
  auVar58._12_4_ = fStack_3ec;
  auVar130 = vsubps_avx(auVar58,(undefined1  [16])aVar7);
  auVar130 = vdpps_avx(auVar130,auVar255,0x7f);
  auVar118 = vsubps_avx(_local_3a8,(undefined1  [16])aVar7);
  auVar118 = vdpps_avx(auVar118,auVar255,0x7f);
  auVar152 = vsubps_avx(_local_3b8,(undefined1  [16])aVar7);
  auVar152 = vdpps_avx(auVar152,auVar255,0x7f);
  auVar119 = vsubps_avx(_local_3c8,(undefined1  [16])aVar7);
  auVar119 = vdpps_avx(auVar119,auVar255,0x7f);
  auVar15 = vsubps_avx(_local_2b8,(undefined1  [16])aVar7);
  auVar255 = vdpps_avx(auVar15,auVar255,0x7f);
  fVar221 = 1.0 - fVar224;
  fVar239 = 1.0 - fVar193;
  fVar215 = auVar273._4_4_;
  fVar237 = auVar273._8_4_;
  fVar218 = auVar273._12_4_;
  fVar238 = fVar239 * fVar193 * fVar193 * 3.0;
  auVar234._0_4_ = fVar193 * fVar193 * fVar193;
  auVar234._4_4_ = fVar215 * fVar215 * fVar215;
  auVar234._8_4_ = fVar237 * fVar237 * fVar237;
  auVar234._12_4_ = fVar218 * fVar218 * fVar218;
  fVar215 = fVar193 * 3.0 * fVar239 * fVar239;
  fVar237 = fVar239 * fVar239 * fVar239;
  fVar193 = (fVar221 * auVar87._0_4_ + auVar118._0_4_ * fVar224) * fVar237 +
            fVar215 * (auVar152._0_4_ * fVar224 + fVar221 * auVar300._0_4_) +
            fVar238 * (auVar119._0_4_ * fVar224 + fVar221 * auVar166._0_4_) +
            auVar234._0_4_ * (fVar221 * auVar130._0_4_ + fVar224 * auVar255._0_4_);
  if ((fVar193 < (ray->org).field_0.m128[3]) || (fVar224 = ray->tfar, fVar224 < fVar193))
  goto LAB_00946d56;
  pGVar9 = (context->scene->geometries).items[local_400].ptr;
  if ((pGVar9->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar63 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00947c17;
    auVar87 = vshufps_avx(auVar273,auVar273,0x55);
    auVar281._8_4_ = 0x3f800000;
    auVar281._0_8_ = 0x3f8000003f800000;
    auVar281._12_4_ = 0x3f800000;
    auVar300 = vsubps_avx(auVar281,auVar87);
    fVar218 = auVar87._0_4_;
    fVar221 = auVar87._4_4_;
    fVar170 = auVar87._8_4_;
    fVar186 = auVar87._12_4_;
    fVar188 = auVar300._0_4_;
    fVar190 = auVar300._4_4_;
    fVar104 = auVar300._8_4_;
    fVar105 = auVar300._12_4_;
    auVar291._0_4_ = fVar218 * (float)local_3a8._0_4_ + fVar188 * (float)local_378._0_4_;
    auVar291._4_4_ = fVar221 * (float)local_3a8._4_4_ + fVar190 * (float)local_378._4_4_;
    auVar291._8_4_ = fVar170 * fStack_3a0 + fVar104 * fStack_370;
    auVar291._12_4_ = fVar186 * fStack_39c + fVar105 * fStack_36c;
    auVar306._0_4_ = fVar218 * (float)local_3b8._0_4_ + fVar188 * (float)local_388._0_4_;
    auVar306._4_4_ = fVar221 * (float)local_3b8._4_4_ + fVar190 * (float)local_388._4_4_;
    auVar306._8_4_ = fVar170 * fStack_3b0 + fVar104 * fStack_380;
    auVar306._12_4_ = fVar186 * fStack_3ac + fVar105 * fStack_37c;
    auVar313._0_4_ = fVar218 * (float)local_3c8._0_4_ + fVar188 * (float)local_398._0_4_;
    auVar313._4_4_ = fVar221 * (float)local_3c8._4_4_ + fVar190 * (float)local_398._4_4_;
    auVar313._8_4_ = fVar170 * fStack_3c0 + fVar104 * fStack_390;
    auVar313._12_4_ = fVar186 * fStack_3bc + fVar105 * fStack_38c;
    auVar263._0_4_ = fVar188 * local_3f8 + fVar218 * (float)local_2b8._0_4_;
    auVar263._4_4_ = fVar190 * fStack_3f4 + fVar221 * (float)local_2b8._4_4_;
    auVar263._8_4_ = fVar104 * fStack_3f0 + fVar170 * fStack_2b0;
    auVar263._12_4_ = fVar105 * fStack_3ec + fVar186 * fStack_2ac;
    auVar130 = vsubps_avx(auVar306,auVar291);
    auVar118 = vsubps_avx(auVar313,auVar306);
    auVar152 = vsubps_avx(auVar263,auVar313);
    auVar87 = vshufps_avx(auVar273,auVar273,0);
    fVar186 = auVar87._0_4_;
    fVar188 = auVar87._4_4_;
    fVar190 = auVar87._8_4_;
    fVar104 = auVar87._12_4_;
    auVar87 = vshufps_avx(ZEXT416((uint)fVar239),ZEXT416((uint)fVar239),0);
    fVar218 = auVar87._0_4_;
    fVar221 = auVar87._4_4_;
    fVar239 = auVar87._8_4_;
    fVar170 = auVar87._12_4_;
    auVar87 = vshufps_avx(auVar234,auVar234,0);
    auVar300 = vshufps_avx(ZEXT416((uint)fVar238),ZEXT416((uint)fVar238),0);
    auVar166 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
    auVar212._0_4_ =
         ((auVar130._0_4_ * fVar218 + fVar186 * auVar118._0_4_) * fVar218 +
         fVar186 * (auVar118._0_4_ * fVar218 + fVar186 * auVar152._0_4_)) * 3.0;
    auVar212._4_4_ =
         ((auVar130._4_4_ * fVar221 + fVar188 * auVar118._4_4_) * fVar221 +
         fVar188 * (auVar118._4_4_ * fVar221 + fVar188 * auVar152._4_4_)) * 3.0;
    auVar212._8_4_ =
         ((auVar130._8_4_ * fVar239 + fVar190 * auVar118._8_4_) * fVar239 +
         fVar190 * (auVar118._8_4_ * fVar239 + fVar190 * auVar152._8_4_)) * 3.0;
    auVar212._12_4_ =
         ((auVar130._12_4_ * fVar170 + fVar104 * auVar118._12_4_) * fVar170 +
         fVar104 * (auVar118._12_4_ * fVar170 + fVar104 * auVar152._12_4_)) * 3.0;
    auVar130 = vshufps_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),0);
    auVar133._0_4_ =
         auVar130._0_4_ * (float)local_238._0_4_ +
         auVar166._0_4_ * (float)local_248._0_4_ +
         auVar87._0_4_ * (float)local_268._0_4_ + auVar300._0_4_ * (float)local_258._0_4_;
    auVar133._4_4_ =
         auVar130._4_4_ * (float)local_238._4_4_ +
         auVar166._4_4_ * (float)local_248._4_4_ +
         auVar87._4_4_ * (float)local_268._4_4_ + auVar300._4_4_ * (float)local_258._4_4_;
    auVar133._8_4_ =
         auVar130._8_4_ * fStack_230 +
         auVar166._8_4_ * fStack_240 + auVar87._8_4_ * fStack_260 + auVar300._8_4_ * fStack_250;
    auVar133._12_4_ =
         auVar130._12_4_ * fStack_22c +
         auVar166._12_4_ * fStack_23c + auVar87._12_4_ * fStack_25c + auVar300._12_4_ * fStack_24c;
    auVar87 = vshufps_avx(auVar212,auVar212,0xc9);
    auVar167._0_4_ = auVar133._0_4_ * auVar87._0_4_;
    auVar167._4_4_ = auVar133._4_4_ * auVar87._4_4_;
    auVar167._8_4_ = auVar133._8_4_ * auVar87._8_4_;
    auVar167._12_4_ = auVar133._12_4_ * auVar87._12_4_;
    auVar87 = vshufps_avx(auVar133,auVar133,0xc9);
    auVar134._0_4_ = auVar212._0_4_ * auVar87._0_4_;
    auVar134._4_4_ = auVar212._4_4_ * auVar87._4_4_;
    auVar134._8_4_ = auVar212._8_4_ * auVar87._8_4_;
    auVar134._12_4_ = auVar212._12_4_ * auVar87._12_4_;
    auVar300 = vsubps_avx(auVar134,auVar167);
    auVar87 = vshufps_avx(auVar300,auVar300,0xe9);
    local_298 = vmovlps_avx(auVar87);
    local_290 = auVar300._0_4_;
    local_28c = vmovlps_avx(auVar273);
    local_284 = (int)local_2f8;
    local_280 = (int)local_400;
    local_27c = context->user->instID[0];
    local_278 = context->user->instPrimID[0];
    ray->tfar = fVar193;
    local_48c = -1;
    local_2e8.valid = &local_48c;
    local_2e8.geometryUserPtr = pGVar9->userPtr;
    local_2e8.context = context->user;
    local_2e8.hit = (RTCHitN *)&local_298;
    local_2e8.N = 1;
    local_2e8.ray = (RTCRayN *)ray;
    if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
       ((*pGVar9->occlusionFilterN)(&local_2e8), *local_2e8.valid != 0)) {
      p_Var14 = context->args->filter;
      if ((p_Var14 == (RTCFilterFunctionN)0x0) ||
         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
            RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar9->field_8).field_0x2 & 0x40) == 0)) ||
          ((*p_Var14)(&local_2e8), *local_2e8.valid != 0)))) {
        bVar63 = 1;
        goto LAB_00947c17;
      }
    }
    ray->tfar = fVar224;
  }
  bVar63 = 0;
LAB_00947c17:
  bVar67 = (bool)(bVar67 | bVar63);
  goto LAB_00946d56;
LAB_00947c30:
  auVar87 = vinsertps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar193),0x10);
  auVar344 = ZEXT1664(auVar87);
  auVar253 = ZEXT1664(local_438);
  auVar332 = ZEXT1664(local_448);
  auVar265 = ZEXT1664(local_328);
  auVar283 = ZEXT1664(local_338);
  auVar294 = ZEXT1664(local_348);
  auVar308 = ZEXT1664(local_358);
  auVar315 = ZEXT1664(local_368);
  auVar322 = ZEXT1664(auVar251);
  goto LAB_009466f0;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }